

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

bool embree::avx::InstanceArrayIntersector1MB::pointQuery
               (PointQuery *query,PointQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  undefined8 uVar5;
  int iVar6;
  Geometry *pGVar7;
  RTCPointQueryContext *pRVar8;
  bool bVar9;
  undefined1 uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  Ref<embree::Geometry> *pRVar16;
  long *plVar17;
  uint uVar18;
  undefined4 uVar19;
  long lVar20;
  _func_int *p_Var21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar75;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 in_ZMM1 [64];
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar108;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar107;
  undefined1 in_ZMM2 [64];
  float fVar109;
  vfloat4 a0;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar124;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  float fVar123;
  undefined1 in_ZMM3 [64];
  vfloat4 a0_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 in_ZMM4 [64];
  float fVar144;
  vfloat4 b0;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 in_ZMM5 [64];
  float fVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 in_ZMM6 [64];
  float fVar161;
  undefined1 auVar162 [16];
  float fVar166;
  undefined1 auVar163 [16];
  float fVar164;
  float fVar165;
  undefined1 in_ZMM7 [64];
  float fVar167;
  float fVar172;
  float fVar173;
  vfloat4 a1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar174;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar184 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar185 [16];
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM15 [64];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined4 local_e0;
  float local_dc;
  float local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  _func_int *local_98;
  undefined8 local_90;
  PointQuery *local_88;
  undefined4 local_80;
  undefined1 local_78 [16];
  float local_68;
  void *local_60;
  undefined8 local_58;
  undefined1 local_48 [16];
  undefined1 auVar95 [16];
  
  auVar73 = in_ZMM6._0_16_;
  auVar74 = in_ZMM7._0_16_;
  auVar182 = in_ZMM11._0_16_;
  auVar185 = in_ZMM13._0_16_;
  auVar184 = in_ZMM12._0_16_;
  auVar95 = in_ZMM15._0_16_;
  b0.field_0 = in_ZMM5._0_16_;
  a0_1.field_0 = in_ZMM4._0_16_;
  a0.field_0 = in_ZMM3._0_16_;
  auVar58 = in_ZMM14._0_16_;
  auVar177 = in_ZMM9._0_16_;
  auVar94 = in_ZMM2._0_16_;
  auVar71 = in_ZMM0._0_16_;
  auVar98 = in_ZMM1._0_16_;
  uVar11 = (ulong)prim->primID_;
  pRVar16 = (context->scene->geometries).items;
  pGVar7 = pRVar16[prim->instID_].ptr;
  p_Var21 = *(_func_int **)&pGVar7->field_0x58;
  if ((p_Var21 == (_func_int *)0x0) &&
     ((pRVar16 = (Ref<embree::Geometry> *)
                 (ulong)*(uint *)(*(long *)&pGVar7[1].time_range.upper +
                                 (long)pGVar7[1].intersectionFilterN * uVar11),
      pRVar16 == (Ref<embree::Geometry> *)0xffffffff ||
      (p_Var21 = pGVar7[1].super_RefCount._vptr_RefCount[(long)pRVar16], p_Var21 == (_func_int *)0x0
      )))) {
    return false;
  }
  if (pGVar7->numTimeSteps == 1) {
    plVar17 = *(long **)&pGVar7[1].fnumTimeSegments;
    iVar6 = (int)plVar17[4];
    if ((pGVar7->field_8).field_0x1 == '\x01') {
      if (iVar6 < 0x9244) {
        if (iVar6 == 0x9134) {
          lVar13 = *plVar17;
          lVar12 = uVar11 * plVar17[2];
          auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x10 + lVar12)),0x1c);
          auVar98 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar13 + 0x20 + lVar12)),0x28);
          auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x14 + lVar12)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),0x28);
          auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),0x1c);
          auVar94 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar13 + 0x28 + lVar12)),0x28);
          auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x1c + lVar12)),0x1c);
          auVar71 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar13 + 0x2c + lVar12)),0x28);
        }
        else if (iVar6 == 0x9234) {
          lVar13 = *plVar17;
          lVar12 = uVar11 * plVar17[2];
          auVar40._8_8_ = 0;
          auVar40._0_8_ = *(ulong *)(lVar13 + 4 + lVar12);
          auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar40,0x4c);
          auVar98 = vshufps_avx(auVar95,auVar95,0x78);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
          auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),auVar41,0x4c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar95,auVar95,0x78);
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
          auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar42,0x4c);
          auVar94 = vshufps_avx(auVar95,auVar95,0x78);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)(lVar13 + 0x28 + lVar12);
          auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),auVar43,0x4c);
          auVar71 = vshufps_avx(auVar95,auVar95,0x78);
        }
      }
      else if (iVar6 == 0xb001) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        auVar56._8_8_ = 0;
        auVar56._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
        auVar95 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),0x20);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = *(ulong *)(lVar13 + 0x34 + lVar12);
        auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar57);
        auVar74 = vshufps_avx(auVar71,auVar57,0xd8);
        auVar136._8_8_ = 0;
        auVar136._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
        auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar136);
        auVar73 = vshufps_avx(auVar71,auVar136,0xd8);
        fVar75 = *(float *)(lVar13 + 0x24 + lVar12);
        fVar109 = *(float *)(lVar13 + 0x28 + lVar12);
        fVar122 = *(float *)(lVar13 + 0x2c + lVar12);
        fVar123 = *(float *)(lVar13 + 0x30 + lVar12);
        fVar93 = fVar123 * fVar123 + fVar122 * fVar122 + fVar75 * fVar75 + fVar109 * fVar109;
        auVar71 = vrsqrtss_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93));
        fVar106 = auVar71._0_4_;
        fVar93 = fVar106 * 1.5 + fVar106 * fVar106 * fVar106 * fVar93 * -0.5;
        auVar71 = vinsertps_avx(auVar73,ZEXT416((uint)(fVar93 * fVar75)),0x30);
        auVar98 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar93 * fVar109)),0x30);
        auVar74 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),0x10);
        auVar94 = vinsertps_avx(auVar95,ZEXT416((uint)(fVar93 * fVar123)),0x30);
        auVar95 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar13 + 0x3c + lVar12)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar95,ZEXT416((uint)(fVar93 * fVar122)),0x30);
      }
      else if (iVar6 == 0x9244) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        auVar98 = *(undefined1 (*) [16])(lVar13 + lVar12);
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar13 + 0x10 + lVar12);
        auVar94 = *(undefined1 (*) [16])(lVar13 + 0x20 + lVar12);
        auVar71 = *(undefined1 (*) [16])(lVar13 + 0x30 + lVar12);
      }
      auVar95 = vshufps_avx(auVar71,auVar71,0xff);
      auVar74 = vshufps_avx(auVar98,auVar98,0xff);
      auVar73 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar182 = vshufps_avx(auVar94,auVar94,0xff);
      fVar164 = auVar74._0_4_;
      fVar161 = auVar95._0_4_;
      fVar108 = auVar73._0_4_;
      fVar124 = auVar182._0_4_;
      fVar75 = fVar164 * fVar108 + fVar124 * fVar161;
      fVar123 = fVar164 * fVar108 - fVar124 * fVar161;
      fVar93 = fVar161 * fVar161 - fVar164 * fVar164;
      fVar106 = fVar164 * fVar124 - fVar108 * fVar161;
      fVar109 = fVar164 * fVar124 + fVar108 * fVar161;
      fVar122 = fVar164 * fVar161 + fVar108 * fVar124;
      fVar107 = fVar108 * fVar124 - fVar164 * fVar161;
      auVar95 = ZEXT416((uint)(-fVar124 * fVar124 +
                              -fVar108 * fVar108 + fVar161 * fVar161 + fVar164 * fVar164));
      auVar95 = vshufps_avx(auVar95,auVar95,0);
      auVar74 = ZEXT416((uint)(fVar75 + fVar75));
      auVar74 = vshufps_avx(auVar74,auVar74,0);
      auVar73 = ZEXT416((uint)(fVar106 + fVar106));
      auVar73 = vshufps_avx(auVar73,auVar73,0);
      aVar130._0_4_ = auVar95._0_4_ * 1.0 + auVar74._0_4_ * 0.0 + auVar73._0_4_ * 0.0;
      aVar130._4_4_ = auVar95._4_4_ * 0.0 + auVar74._4_4_ * 1.0 + auVar73._4_4_ * 0.0;
      aVar130._8_4_ = auVar95._8_4_ * 0.0 + auVar74._8_4_ * 0.0 + auVar73._8_4_ * 1.0;
      aVar130._12_4_ = auVar95._12_4_ * 0.0 + auVar74._12_4_ * 0.0 + auVar73._12_4_ * 0.0;
      auVar95 = ZEXT416((uint)(-fVar124 * fVar124 + fVar108 * fVar108 + fVar93));
      auVar95 = vshufps_avx(auVar95,auVar95,0);
      auVar74 = ZEXT416((uint)(fVar122 + fVar122));
      auVar74 = vshufps_avx(auVar74,auVar74,0);
      auVar73 = ZEXT416((uint)(fVar123 + fVar123));
      auVar73 = vshufps_avx(auVar73,auVar73,0);
      b0.field_0._0_4_ = auVar73._0_4_ * 1.0 + auVar95._0_4_ * 0.0 + auVar74._0_4_ * 0.0;
      b0.field_0._4_4_ = auVar73._4_4_ * 0.0 + auVar95._4_4_ * 1.0 + auVar74._4_4_ * 0.0;
      b0.field_0._8_4_ = auVar73._8_4_ * 0.0 + auVar95._8_4_ * 0.0 + auVar74._8_4_ * 1.0;
      b0.field_0._12_4_ = auVar73._12_4_ * 0.0 + auVar95._12_4_ * 0.0 + auVar74._12_4_ * 0.0;
      auVar95 = ZEXT416((uint)(-fVar108 * fVar108 + fVar93 + fVar124 * fVar124));
      auVar74 = vshufps_avx(auVar95,auVar95,0);
      auVar95 = ZEXT416((uint)(fVar107 + fVar107));
      auVar73 = vshufps_avx(auVar95,auVar95,0);
      auVar95 = ZEXT416((uint)(fVar109 + fVar109));
      auVar182 = vshufps_avx(auVar95,auVar95,0);
      auVar95 = vshufps_avx(auVar98,ZEXT416(0) << 0x20,0xe9);
      auVar95 = vblendps_avx(auVar95,(undefined1  [16])a0.field_0,4);
      fVar75 = auVar182._0_4_ * 1.0 + auVar73._0_4_ * 0.0 + auVar74._0_4_ * 0.0;
      fVar109 = auVar182._4_4_ * 0.0 + auVar73._4_4_ * 1.0 + auVar74._4_4_ * 0.0;
      fVar122 = auVar182._8_4_ * 0.0 + auVar73._8_4_ * 0.0 + auVar74._8_4_ * 1.0;
      fVar123 = auVar182._12_4_ * 0.0 + auVar73._12_4_ * 0.0 + auVar74._12_4_ * 0.0;
      auVar73._0_4_ = auVar95._0_4_ + 0.0;
      auVar73._4_4_ = auVar95._4_4_ + 0.0;
      auVar73._8_4_ = auVar95._8_4_ + 0.0;
      auVar73._12_4_ = auVar95._12_4_ + 0.0;
      auVar74 = vshufps_avx(auVar98,auVar98,0);
      auVar177._0_4_ = fVar75 * 0.0;
      auVar177._4_4_ = fVar109 * 0.0;
      auVar177._8_4_ = fVar122 * 0.0;
      auVar177._12_4_ = fVar123 * 0.0;
      auVar95._0_4_ = auVar74._0_4_ * aVar130._0_4_ + auVar177._0_4_ + b0.field_0._0_4_ * 0.0;
      auVar95._4_4_ = auVar74._4_4_ * aVar130._4_4_ + auVar177._4_4_ + b0.field_0._4_4_ * 0.0;
      auVar95._8_4_ = auVar74._8_4_ * aVar130._8_4_ + auVar177._8_4_ + b0.field_0._8_4_ * 0.0;
      auVar95._12_4_ = auVar74._12_4_ * aVar130._12_4_ + auVar177._12_4_ + b0.field_0._12_4_ * 0.0;
      auVar74 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0);
      auVar184 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0x55);
      auVar182._0_4_ =
           auVar74._0_4_ * aVar130._0_4_ + auVar177._0_4_ + auVar184._0_4_ * b0.field_0._0_4_;
      auVar182._4_4_ =
           auVar74._4_4_ * aVar130._4_4_ + auVar177._4_4_ + auVar184._4_4_ * b0.field_0._4_4_;
      auVar182._8_4_ =
           auVar74._8_4_ * aVar130._8_4_ + auVar177._8_4_ + auVar184._8_4_ * b0.field_0._8_4_;
      auVar182._12_4_ =
           auVar74._12_4_ * aVar130._12_4_ + auVar177._12_4_ + auVar184._12_4_ * b0.field_0._12_4_;
      auVar184 = vshufps_avx(auVar94,auVar94,0x55);
      auVar58 = vshufps_avx(auVar94,auVar94,0xaa);
      auVar74._0_4_ = auVar58._0_4_ * fVar75;
      auVar74._4_4_ = auVar58._4_4_ * fVar109;
      auVar74._8_4_ = auVar58._8_4_ * fVar122;
      auVar74._12_4_ = auVar58._12_4_ * fVar123;
      a0.field_0._0_4_ = auVar184._0_4_ * b0.field_0._0_4_ + auVar74._0_4_;
      a0.field_0._4_4_ = auVar184._4_4_ * b0.field_0._4_4_ + auVar74._4_4_;
      a0.field_0._8_4_ = auVar184._8_4_ * b0.field_0._8_4_ + auVar74._8_4_;
      a0.field_0._12_4_ = auVar184._12_4_ * b0.field_0._12_4_ + auVar74._12_4_;
      auVar58 = vshufps_avx(auVar94,auVar94,0);
      auVar184._0_4_ = auVar58._0_4_ * aVar130._0_4_ + a0.field_0._0_4_;
      auVar184._4_4_ = auVar58._4_4_ * aVar130._4_4_ + a0.field_0._4_4_;
      auVar184._8_4_ = auVar58._8_4_ * aVar130._8_4_ + a0.field_0._8_4_;
      auVar184._12_4_ = auVar58._12_4_ * aVar130._12_4_ + a0.field_0._12_4_;
      auVar58 = vshufps_avx(auVar71,auVar71,0xaa);
      auVar185 = vshufps_avx(auVar71,auVar71,0x55);
      auVar94._0_4_ = auVar185._0_4_ * b0.field_0._0_4_;
      auVar94._4_4_ = auVar185._4_4_ * b0.field_0._4_4_;
      auVar94._8_4_ = auVar185._8_4_ * b0.field_0._8_4_;
      auVar94._12_4_ = auVar185._12_4_ * b0.field_0._12_4_;
      auVar98._0_4_ = auVar94._0_4_ + auVar58._0_4_ * fVar75;
      auVar98._4_4_ = auVar94._4_4_ + auVar58._4_4_ * fVar109;
      auVar98._8_4_ = auVar94._8_4_ + auVar58._8_4_ * fVar122;
      auVar98._12_4_ = auVar94._12_4_ + auVar58._12_4_ * fVar123;
      auVar58 = vshufps_avx(auVar71,auVar71,0);
      auVar71._0_4_ = auVar58._0_4_ * aVar130._0_4_ + auVar98._0_4_;
      auVar71._4_4_ = auVar58._4_4_ * aVar130._4_4_ + auVar98._4_4_;
      auVar71._8_4_ = auVar58._8_4_ * aVar130._8_4_ + auVar98._8_4_;
      auVar71._12_4_ = auVar58._12_4_ * aVar130._12_4_ + auVar98._12_4_;
LAB_0155274a:
      auVar185._0_4_ = auVar73._0_4_ + auVar71._0_4_;
      auVar185._4_4_ = auVar73._4_4_ + auVar71._4_4_;
      auVar185._8_4_ = auVar73._8_4_ + auVar71._8_4_;
      auVar185._12_4_ = auVar73._12_4_ + auVar71._12_4_;
    }
    else {
      aVar130 = a0_1.field_0;
      if (iVar6 < 0x9244) {
        if (iVar6 == 0x9134) {
          lVar13 = *plVar17;
          lVar12 = uVar11 * plVar17[2];
          uVar18 = *(uint *)(lVar13 + 4 + lVar12);
          auVar98 = ZEXT416(uVar18);
          uVar15 = *(uint *)(lVar13 + 8 + lVar12);
          auVar94 = ZEXT416(uVar15);
          uVar4 = *(uint *)(lVar13 + 0xc + lVar12);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar4);
          auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x10 + lVar12)),0x1c);
          auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar13 + 0x20 + lVar12)),0x28);
          auVar71 = vinsertps_avx(ZEXT416(uVar18),ZEXT416(*(uint *)(lVar13 + 0x14 + lVar12)),0x1c);
          auVar182 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),0x28);
          auVar71 = vinsertps_avx(ZEXT416(uVar15),ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),0x1c);
          auVar184 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar13 + 0x28 + lVar12)),0x28);
          auVar71 = vinsertps_avx(ZEXT416(uVar4),ZEXT416(*(uint *)(lVar13 + 0x1c + lVar12)),0x1c);
          auVar185 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar13 + 0x2c + lVar12)),0x28);
        }
        else if (iVar6 == 0x9234) {
          lVar13 = *plVar17;
          lVar12 = uVar11 * plVar17[2];
          auVar22._8_8_ = 0;
          auVar22._0_8_ = *(ulong *)(lVar13 + 4 + lVar12);
          auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar22,0x4c);
          auVar95 = vshufps_avx(auVar95,auVar95,0x78);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),auVar23,0x4c);
          auVar182 = vshufps_avx(auVar71,auVar71,0x78);
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar24,0x4c);
          auVar184 = vshufps_avx(auVar71,auVar71,0x78);
          auVar25._8_8_ = 0;
          auVar25._0_8_ = *(ulong *)(lVar13 + 0x28 + lVar12);
          uVar18 = *(uint *)(lVar13 + 0x24 + lVar12);
          auVar98 = ZEXT416(uVar18);
          auVar71 = vshufps_avx(ZEXT416(uVar18),auVar25,0x4c);
          auVar185 = vshufps_avx(auVar71,auVar71,0x78);
        }
      }
      else if (iVar6 == 0xb001) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
        auVar71 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),0x20);
        auVar77._8_8_ = 0;
        auVar77._0_8_ = *(ulong *)(lVar13 + 0x34 + lVar12);
        auVar95 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar77);
        auVar182 = vshufps_avx(auVar95,auVar77,0xd8);
        auVar125._8_8_ = 0;
        auVar125._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
        auVar95 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar125);
        auVar184 = vshufps_avx(auVar95,auVar125,0xd8);
        fVar75 = *(float *)(lVar13 + 0x24 + lVar12);
        fVar109 = *(float *)(lVar13 + 0x28 + lVar12);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)fVar109);
        fVar122 = *(float *)(lVar13 + 0x2c + lVar12);
        auVar73 = ZEXT416((uint)fVar122);
        fVar123 = *(float *)(lVar13 + 0x30 + lVar12);
        auVar74 = ZEXT416((uint)fVar123);
        fVar93 = fVar123 * fVar123 + fVar122 * fVar122 + fVar75 * fVar75 + fVar109 * fVar109;
        auVar95 = vrsqrtss_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93));
        fVar106 = auVar95._0_4_;
        auVar177 = ZEXT416((uint)(fVar106 * fVar106));
        fVar93 = fVar106 * 1.5 + fVar106 * fVar106 * fVar106 * fVar93 * -0.5;
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar93 * fVar75));
        auVar185 = vinsertps_avx(auVar184,ZEXT416((uint)(fVar93 * fVar75)),0x30);
        auVar95 = vinsertps_avx(auVar182,ZEXT416((uint)(fVar93 * fVar109)),0x30);
        auVar98 = ZEXT416((uint)(fVar93 * fVar122));
        auVar94 = ZEXT416((uint)(fVar93 * fVar123));
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                                   ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),0x10);
        auVar184 = vinsertps_avx(auVar71,ZEXT416((uint)(fVar93 * fVar123)),0x30);
        auVar71 = vinsertps_avx((undefined1  [16])a0.field_0,
                                ZEXT416(*(uint *)(lVar13 + 0x3c + lVar12)),0x20);
        auVar182 = vinsertps_avx(auVar71,ZEXT416((uint)(fVar93 * fVar122)),0x30);
      }
      else if (iVar6 == 0x9244) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        auVar95 = *(undefined1 (*) [16])(lVar13 + lVar12);
        auVar182 = *(undefined1 (*) [16])(lVar13 + 0x10 + lVar12);
        auVar184 = *(undefined1 (*) [16])(lVar13 + 0x20 + lVar12);
        auVar185 = *(undefined1 (*) [16])(lVar13 + 0x30 + lVar12);
      }
    }
  }
  else {
    fVar75 = (pGVar7->time_range).lower;
    fVar109 = (pGVar7->time_range).upper;
    a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)fVar109);
    fVar75 = pGVar7->fnumTimeSegments * ((query->time - fVar75) / (fVar109 - fVar75));
    auVar71 = ZEXT416((uint)fVar75);
    auVar95 = vroundss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75),9);
    auVar98 = vminss_avx(auVar95,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
    auVar95 = ZEXT816(0) << 0x20;
    auVar94 = SUB6416(ZEXT864(0),0) << 0x20;
    auVar98 = vmaxss_avx(auVar95,auVar98);
    iVar14 = (int)auVar98._0_4_;
    fVar75 = fVar75 - auVar98._0_4_;
    lVar13 = *(long *)&pGVar7[1].fnumTimeSegments;
    lVar12 = CONCAT44((int)((ulong)pRVar16 >> 0x20),iVar14) * 0x38;
    plVar17 = (long *)(lVar13 + lVar12);
    iVar6 = *(int *)(lVar13 + 0x20 + lVar12);
    auVar89 = ZEXT416((uint)fVar75);
    if ((pGVar7->field_8).field_0x1 == '\x01') {
      if (iVar6 < 0x9244) {
        if (iVar6 == 0x9134) {
          lVar12 = *plVar17;
          lVar20 = plVar17[2] * uVar11;
          uVar18 = *(uint *)(lVar12 + 8 + lVar20);
          auVar95 = ZEXT416(uVar18);
          auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + lVar20)),
                                  ZEXT416(*(uint *)(lVar12 + 0x10 + lVar20)),0x1c);
          auVar182 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar20)),0x28);
          auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 4 + lVar20)),
                                  ZEXT416(*(uint *)(lVar12 + 0x14 + lVar20)),0x1c);
          auVar184 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar20)),0x28);
          auVar71 = vinsertps_avx(ZEXT416(uVar18),ZEXT416(*(uint *)(lVar12 + 0x18 + lVar20)),0x1c);
          auVar58 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar20)),0x28);
          auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar20)),
                                  ZEXT416(*(uint *)(lVar12 + 0x1c + lVar20)),0x1c);
          auVar185 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar20)),0x28);
        }
        else if (iVar6 == 0x9234) {
          lVar12 = *plVar17;
          lVar20 = plVar17[2] * uVar11;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(lVar12 + 4 + lVar20);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + lVar20)),auVar44,0x4c);
          auVar182 = vshufps_avx(auVar71,auVar71,0x78);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar20);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar20)),auVar45,0x4c);
          auVar184 = vshufps_avx(auVar71,auVar71,0x78);
          auVar46._8_8_ = 0;
          auVar46._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar20);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar20)),auVar46,0x4c);
          auVar58 = vshufps_avx(auVar71,auVar71,0x78);
          auVar47._8_8_ = 0;
          auVar47._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar20);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0x24 + lVar20)),auVar47,0x4c);
          auVar185 = vshufps_avx(auVar71,auVar71,0x78);
        }
      }
      else if (iVar6 == 0xb001) {
        lVar12 = *plVar17;
        lVar20 = plVar17[2] * uVar11;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar20);
        auVar71 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(lVar12 + 8 + lVar20)),0x20);
        auVar85._8_8_ = 0;
        auVar85._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar20);
        auVar95 = vmovlhps_avx(ZEXT416(*(uint *)(lVar12 + lVar20)),auVar85);
        auVar74 = vshufps_avx(auVar95,auVar85,0xd8);
        auVar137._8_8_ = 0;
        auVar137._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar20);
        auVar95 = vmovlhps_avx(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar20)),auVar137);
        auVar73 = vshufps_avx(auVar95,auVar137,0xd8);
        fVar109 = *(float *)(lVar12 + 0x24 + lVar20);
        fVar122 = *(float *)(lVar12 + 0x28 + lVar20);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)fVar122);
        fVar123 = *(float *)(lVar12 + 0x2c + lVar20);
        fVar93 = *(float *)(lVar12 + 0x30 + lVar20);
        fVar106 = fVar93 * fVar93 + fVar123 * fVar123 + fVar109 * fVar109 + fVar122 * fVar122;
        auVar95 = vrsqrtss_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106));
        fVar107 = auVar95._0_4_;
        auVar177 = ZEXT416((uint)(fVar107 * fVar107));
        fVar106 = fVar107 * 1.5 + fVar107 * fVar107 * fVar107 * fVar106 * -0.5;
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       ZEXT416((uint)(fVar106 * fVar109));
        auVar185 = vinsertps_avx(auVar73,ZEXT416((uint)(fVar106 * fVar109)),0x30);
        auVar182 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar106 * fVar122)),0x30);
        auVar95 = ZEXT416((uint)(fVar106 * fVar93));
        auVar74 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar20)),
                                ZEXT416(*(uint *)(lVar12 + 4 + lVar20)),0x10);
        auVar58 = vinsertps_avx(auVar71,ZEXT416((uint)(fVar106 * fVar93)),0x30);
        auVar71 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar20)),0x20);
        auVar184 = vinsertps_avx(auVar71,ZEXT416((uint)(fVar106 * fVar123)),0x30);
      }
      else if (iVar6 == 0x9244) {
        lVar12 = *plVar17;
        lVar20 = plVar17[2] * uVar11;
        auVar182 = *(undefined1 (*) [16])(lVar12 + lVar20);
        auVar184 = *(undefined1 (*) [16])(lVar12 + 0x10 + lVar20);
        auVar58 = *(undefined1 (*) [16])(lVar12 + 0x20 + lVar20);
        auVar185 = *(undefined1 (*) [16])(lVar12 + 0x30 + lVar20);
      }
      lVar12 = (ulong)(iVar14 + 1) * 0x38;
      plVar17 = (long *)(lVar13 + lVar12);
      iVar6 = *(int *)(lVar13 + 0x20 + lVar12);
      if (iVar6 < 0x9244) {
        if (iVar6 == 0x9134) {
          lVar13 = *plVar17;
          lVar12 = uVar11 * plVar17[2];
          auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x10 + lVar12)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar13 + 0x20 + lVar12)),0x28);
          auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x14 + lVar12)),0x1c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),0x28);
          auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),0x1c);
          auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar13 + 0x28 + lVar12)),0x28);
          auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x1c + lVar12)),0x1c);
          auVar177 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar13 + 0x2c + lVar12)),0x28);
        }
        else if (iVar6 == 0x9234) {
          lVar13 = *plVar17;
          lVar12 = uVar11 * plVar17[2];
          auVar59._8_8_ = 0;
          auVar59._0_8_ = *(ulong *)(lVar13 + 4 + lVar12);
          auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar59,0x4c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vshufps_avx(auVar95,auVar95,0x78);
          auVar60._8_8_ = 0;
          auVar60._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
          auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),auVar60,0x4c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar95,auVar95,0x78);
          auVar61._8_8_ = 0;
          auVar61._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
          auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar61,0x4c);
          auVar95 = vshufps_avx(auVar95,auVar95,0x78);
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)(lVar13 + 0x28 + lVar12);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),auVar62,0x4c);
          auVar177 = vshufps_avx(auVar71,auVar71,0x78);
        }
      }
      else if (iVar6 == 0xb001) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        auVar70._8_8_ = 0;
        auVar70._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
        auVar95 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),0x20);
        auVar87._8_8_ = 0;
        auVar87._0_8_ = *(ulong *)(lVar13 + 0x34 + lVar12);
        auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar87);
        auVar74 = vshufps_avx(auVar71,auVar87,0xd8);
        auVar140._8_8_ = 0;
        auVar140._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
        auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar140);
        auVar73 = vshufps_avx(auVar71,auVar140,0xd8);
        fVar109 = *(float *)(lVar13 + 0x24 + lVar12);
        fVar122 = *(float *)(lVar13 + 0x28 + lVar12);
        fVar123 = *(float *)(lVar13 + 0x2c + lVar12);
        fVar93 = *(float *)(lVar13 + 0x30 + lVar12);
        fVar106 = fVar93 * fVar93 + fVar123 * fVar123 + fVar109 * fVar109 + fVar122 * fVar122;
        auVar71 = vrsqrtss_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106));
        fVar107 = auVar71._0_4_;
        fVar106 = fVar107 * 1.5 + fVar107 * fVar107 * fVar107 * fVar106 * -0.5;
        auVar177 = vinsertps_avx(auVar73,ZEXT416((uint)(fVar106 * fVar109)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar74,ZEXT416((uint)(fVar106 * fVar122)),0x30);
        auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),0x10);
        auVar95 = vinsertps_avx(auVar95,ZEXT416((uint)(fVar106 * fVar93)),0x30);
        auVar71 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar13 + 0x3c + lVar12)),0x20);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar71,ZEXT416((uint)(fVar106 * fVar123)),0x30);
      }
      else if (iVar6 == 0x9244) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar13 + lVar12))->v;
        b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar13 + 0x10 + lVar12))->v
        ;
        auVar95 = *(undefined1 (*) [16])(lVar13 + 0x20 + lVar12);
        auVar177 = *(undefined1 (*) [16])(lVar13 + 0x30 + lVar12);
      }
      auVar71 = vshufps_avx(auVar185,auVar185,0xff);
      auVar74 = vshufps_avx(auVar182,auVar182,0xff);
      auVar73 = vshufps_avx(auVar184,auVar184,0xff);
      auVar94 = vshufps_avx(auVar58,auVar58,0xff);
      auVar98 = vshufps_avx(auVar177,auVar177,0xff);
      auVar85 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar137 = vshufps_avx((undefined1  [16])b0.field_0,(undefined1  [16])b0.field_0,0xff);
      _local_258 = vshufps_avx(auVar95,auVar95,0xff);
      fVar122 = auVar74._0_4_;
      fVar123 = auVar71._0_4_;
      fVar106 = auVar73._0_4_;
      fVar93 = auVar94._0_4_;
      fVar109 = fVar93 * local_258._0_4_ +
                fVar106 * auVar137._0_4_ + auVar98._0_4_ * fVar123 + auVar85._0_4_ * fVar122;
      auVar88._0_4_ = -fVar109;
      auVar88._4_4_ = 0x80000000;
      auVar88._8_4_ = 0x80000000;
      auVar88._12_4_ = 0x80000000;
      auVar115._0_8_ = local_258 ^ 0x8000000080000000;
      auVar115._8_4_ = local_258._8_4_ ^ 0x80000000;
      auVar115._12_4_ = local_258._12_4_ ^ 0x80000000;
      if (fVar109 < auVar88._0_4_) {
        auVar180._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
        auVar180._8_4_ = auVar98._8_4_ ^ 0x80000000;
        auVar180._12_4_ = auVar98._12_4_ ^ 0x80000000;
        auVar170._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
        auVar170._8_4_ = auVar85._8_4_ ^ 0x80000000;
        auVar170._12_4_ = auVar85._12_4_ ^ 0x80000000;
        auVar98 = auVar180;
        auVar85 = auVar170;
        _local_258 = auVar115;
      }
      auVar102._8_4_ = 0x7fffffff;
      auVar102._0_8_ = 0x7fffffff7fffffff;
      auVar102._12_4_ = 0x7fffffff;
      auVar71 = vandps_avx(ZEXT416((uint)fVar109),auVar102);
      fVar108 = auVar71._0_4_;
      auVar116._0_8_ = auVar137._0_8_ ^ 0x8000000080000000;
      auVar116._8_4_ = auVar137._8_4_ ^ 0x80000000;
      auVar116._12_4_ = auVar137._12_4_ ^ 0x80000000;
      auVar74 = vcmpss_avx(ZEXT416((uint)fVar109),auVar88,1);
      auVar73 = vmaxss_avx(auVar88,ZEXT416((uint)fVar109));
      fVar107 = auVar73._0_4_;
      fVar109 = 1.0 - fVar108;
      if (fVar109 < 0.0) {
        fVar109 = sqrtf(fVar109);
      }
      else {
        auVar73 = vsqrtss_avx(ZEXT416((uint)fVar109),ZEXT416((uint)fVar109));
        fVar109 = auVar73._0_4_;
      }
      auVar74 = vblendvps_avx(auVar137,auVar116,auVar74);
      auVar94 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(1.5707964 -
                                         fVar109 * (fVar108 * (fVar108 * (fVar108 * (fVar108 * (
                                                  fVar108 * -0.0043095737 + 0.0192803) + -0.04489909
                                                  ) + 0.08785567) + -0.21450998) + 1.5707952))));
      auVar117._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
      auVar117._8_4_ = auVar94._8_4_ ^ 0x80000000;
      auVar117._12_4_ = auVar94._12_4_ ^ 0x80000000;
      auVar73 = vcmpss_avx(ZEXT416((uint)fVar107),ZEXT816(0) << 0x40,1);
      auVar73 = vblendvps_avx(auVar94,auVar117,auVar73);
      auVar71 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar71,1);
      auVar141._8_4_ = 0x7fc00000;
      auVar141._0_8_ = 0x7fc000007fc00000;
      auVar141._12_4_ = 0x7fc00000;
      auVar71 = vblendvps_avx(ZEXT416((uint)(1.5707964 - auVar73._0_4_)),auVar141,auVar71);
      fVar124 = fVar75 * auVar71._0_4_;
      auVar71 = ZEXT416((uint)(fVar124 * 0.63661975));
      auVar71 = vroundss_avx(auVar71,auVar71,9);
      uVar18 = (uint)auVar71._0_4_;
      plVar17 = (long *)CONCAT44((int)((ulong)plVar17 >> 0x20),uVar18);
      fVar124 = fVar124 - auVar71._0_4_ * 1.5707964;
      fVar108 = fVar124 * fVar124;
      fVar109 = fVar108 * (fVar108 * (fVar108 * (fVar108 * (fVar108 * -2.5963018e-07 + 2.4756235e-05
                                                           ) + -0.001388833) + 0.04166664) + -0.5) +
                1.0;
      fVar124 = fVar124 * (fVar108 * (fVar108 * (fVar108 * (fVar108 * (fVar108 * -2.5029328e-08 +
                                                                      2.7600126e-06) +
                                                           -0.00019842605) + 0.008333348) +
                                     -0.16666667) + 1.0);
      fVar108 = fVar109;
      if ((uVar18 & 1) != 0) {
        fVar108 = fVar124;
        fVar124 = fVar109;
      }
      if ((uVar18 & 3) - 1 < 2) {
        fVar108 = -fVar108;
      }
      fVar161 = fVar123 * fVar107 - auVar98._0_4_;
      fVar164 = fVar122 * fVar107 - auVar85._0_4_;
      fVar165 = fVar107 * fVar106 - auVar74._0_4_;
      fVar166 = fVar107 * fVar93 - (float)local_258._0_4_;
      fVar109 = fVar166 * fVar166 + fVar165 * fVar165 + fVar161 * fVar161 + fVar164 * fVar164;
      auVar71 = vrsqrtss_avx(ZEXT416((uint)fVar109),ZEXT416((uint)fVar109));
      fVar144 = auVar71._0_4_;
      fVar109 = fVar144 * 1.5 + fVar144 * fVar144 * fVar144 * fVar109 * -0.5;
      if ((uVar18 & 3) < 2) {
        fVar124 = -fVar124;
      }
      fVar155 = 1.0 - fVar75;
      fVar152 = fVar123 * fVar155 + fVar75 * auVar98._0_4_;
      fVar153 = fVar122 * fVar155 + fVar75 * auVar85._0_4_;
      fVar154 = fVar155 * fVar106 + fVar75 * auVar74._0_4_;
      fVar75 = fVar93 * fVar155 + fVar75 * (float)local_258._0_4_;
      fVar144 = fVar75 * fVar75 + fVar154 * fVar154 + fVar152 * fVar152 + fVar153 * fVar153;
      auVar71 = vrsqrtss_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144));
      fVar158 = auVar71._0_4_;
      fVar144 = fVar158 * 1.5 + fVar158 * fVar158 * fVar158 * fVar144 * -0.5;
      if (0.9995 < fVar107) {
        fVar152 = fVar152 * fVar144;
        fVar153 = fVar153 * fVar144;
        fVar154 = fVar154 * fVar144;
      }
      else {
        fVar152 = fVar108 * fVar123 + fVar109 * fVar161 * fVar124;
        fVar153 = fVar108 * fVar122 + fVar109 * fVar164 * fVar124;
        fVar154 = fVar106 * fVar108 + fVar109 * fVar165 * fVar124;
      }
      local_218 = auVar58._0_4_;
      fStack_214 = auVar58._4_4_;
      fStack_210 = auVar58._8_4_;
      fStack_20c = auVar58._12_4_;
      auVar71 = vcmpss_avx(SUB6416(ZEXT464(0x3f7fdf3b),0),ZEXT416((uint)fVar107),1);
      auVar71 = vblendvps_avx(ZEXT416((uint)(fVar93 * fVar108 + fVar109 * fVar166 * fVar124)),
                              ZEXT416((uint)(fVar144 * fVar75)),auVar71);
      auVar74 = vpermilps_avx(auVar89,0);
      local_148 = a0_1.field_0._0_4_;
      fStack_144 = a0_1.field_0._4_4_;
      fStack_140 = a0_1.field_0._8_4_;
      fStack_13c = a0_1.field_0._12_4_;
      fVar75 = auVar74._0_4_;
      fVar109 = auVar74._4_4_;
      fVar122 = auVar74._8_4_;
      fVar123 = auVar74._12_4_;
      auVar74 = vshufps_avx(ZEXT416((uint)fVar155),ZEXT416((uint)fVar155),0);
      local_1e8 = auVar182._0_4_;
      fStack_1e4 = auVar182._4_4_;
      fStack_1e0 = auVar182._8_4_;
      fStack_1dc = auVar182._12_4_;
      fVar93 = auVar74._0_4_;
      fVar106 = auVar74._4_4_;
      fVar107 = auVar74._8_4_;
      fVar108 = auVar74._12_4_;
      local_248._4_4_ = fVar106 * fStack_1e4 + fVar109 * fStack_144;
      local_248._0_4_ = fVar93 * local_1e8 + fVar75 * local_148;
      fStack_240 = fVar107 * fStack_1e0 + fVar122 * fStack_140;
      fStack_23c = fVar108 * fStack_1dc + fVar123 * fStack_13c;
      local_f8 = b0.field_0._0_4_;
      fStack_f4 = b0.field_0._4_4_;
      fStack_f0 = b0.field_0._8_4_;
      fStack_ec = b0.field_0._12_4_;
      local_1f8 = auVar184._0_4_;
      fStack_1f4 = auVar184._4_4_;
      fStack_1f0 = auVar184._8_4_;
      fStack_1ec = auVar184._12_4_;
      auVar103._0_4_ = fVar93 * local_1f8 + fVar75 * local_f8;
      auVar103._4_4_ = fVar106 * fStack_1f4 + fVar109 * fStack_f4;
      auVar103._8_4_ = fVar107 * fStack_1f0 + fVar122 * fStack_f0;
      auVar103._12_4_ = fVar108 * fStack_1ec + fVar123 * fStack_ec;
      local_138 = auVar95._0_4_;
      fStack_134 = auVar95._4_4_;
      fStack_130 = auVar95._8_4_;
      fStack_12c = auVar95._12_4_;
      auVar89._0_4_ = local_218 * fVar93 + fVar75 * local_138;
      auVar89._4_4_ = fStack_214 * fVar106 + fVar109 * fStack_134;
      auVar89._8_4_ = fStack_210 * fVar107 + fVar122 * fStack_130;
      auVar89._12_4_ = fStack_20c * fVar108 + fVar123 * fStack_12c;
      local_108 = auVar177._0_4_;
      fStack_104 = auVar177._4_4_;
      fStack_100 = auVar177._8_4_;
      fStack_fc = auVar177._12_4_;
      local_208 = auVar185._0_4_;
      fStack_204 = auVar185._4_4_;
      fStack_200 = auVar185._8_4_;
      fStack_1fc = auVar185._12_4_;
      a0.field_0._0_4_ = fVar93 * local_208 + fVar75 * local_108;
      a0.field_0._4_4_ = fVar106 * fStack_204 + fVar109 * fStack_104;
      a0.field_0._8_4_ = fVar107 * fStack_200 + fVar122 * fStack_100;
      a0.field_0._12_4_ = fVar108 * fStack_1fc + fVar123 * fStack_fc;
      fVar108 = auVar71._0_4_;
      fVar75 = fVar153 * fVar154 + fVar108 * fVar152;
      fVar123 = fVar153 * fVar154 - fVar108 * fVar152;
      fVar93 = fVar152 * fVar152 - fVar153 * fVar153;
      fVar106 = fVar108 * fVar153 - fVar152 * fVar154;
      fVar109 = fVar108 * fVar153 + fVar152 * fVar154;
      fVar122 = fVar108 * fVar154 + fVar152 * fVar153;
      fVar107 = fVar108 * fVar154 - fVar152 * fVar153;
      auVar95 = ZEXT416((uint)(-fVar108 * fVar108 +
                              -fVar154 * fVar154 + fVar152 * fVar152 + fVar153 * fVar153));
      auVar95 = vshufps_avx(auVar95,auVar95,0);
      auVar71 = ZEXT416((uint)(fVar75 + fVar75));
      auVar71 = vshufps_avx(auVar71,auVar71,0);
      auVar74 = ZEXT416((uint)(fVar106 + fVar106));
      auVar74 = vshufps_avx(auVar74,auVar74,0);
      aVar130._0_4_ = auVar95._0_4_ * 1.0 + auVar71._0_4_ * 0.0 + auVar74._0_4_ * 0.0;
      aVar130._4_4_ = auVar95._4_4_ * 0.0 + auVar71._4_4_ * 1.0 + auVar74._4_4_ * 0.0;
      aVar130._8_4_ = auVar95._8_4_ * 0.0 + auVar71._8_4_ * 0.0 + auVar74._8_4_ * 1.0;
      aVar130._12_4_ = auVar95._12_4_ * 0.0 + auVar71._12_4_ * 0.0 + auVar74._12_4_ * 0.0;
      auVar95 = ZEXT416((uint)(-fVar108 * fVar108 + fVar154 * fVar154 + fVar93));
      auVar95 = vshufps_avx(auVar95,auVar95,0);
      auVar71 = ZEXT416((uint)(fVar122 + fVar122));
      auVar71 = vshufps_avx(auVar71,auVar71,0);
      auVar74 = ZEXT416((uint)(fVar123 + fVar123));
      auVar74 = vshufps_avx(auVar74,auVar74,0);
      b0.field_0._0_4_ = auVar74._0_4_ * 1.0 + auVar71._0_4_ * 0.0 + auVar95._0_4_ * 0.0;
      b0.field_0._4_4_ = auVar74._4_4_ * 0.0 + auVar71._4_4_ * 0.0 + auVar95._4_4_ * 1.0;
      b0.field_0._8_4_ = auVar74._8_4_ * 0.0 + auVar71._8_4_ * 1.0 + auVar95._8_4_ * 0.0;
      b0.field_0._12_4_ = auVar74._12_4_ * 0.0 + auVar71._12_4_ * 0.0 + auVar95._12_4_ * 0.0;
      auVar95 = ZEXT416((uint)(fVar108 * fVar108 + -fVar154 * fVar154 + fVar93));
      auVar71 = vshufps_avx(auVar95,auVar95,0);
      auVar95 = ZEXT416((uint)(fVar107 + fVar107));
      auVar74 = vshufps_avx(auVar95,auVar95,0);
      auVar95 = ZEXT416((uint)(fVar109 + fVar109));
      auVar73 = vshufps_avx(auVar95,auVar95,0);
      auVar95 = vshufps_avx(_local_248,ZEXT416(0) << 0x20,0xe9);
      auVar95 = vblendps_avx(auVar95,auVar103,4);
      fVar75 = auVar73._0_4_ * 1.0 + auVar74._0_4_ * 0.0 + auVar71._0_4_ * 0.0;
      fVar109 = auVar73._4_4_ * 0.0 + auVar74._4_4_ * 1.0 + auVar71._4_4_ * 0.0;
      fVar122 = auVar73._8_4_ * 0.0 + auVar74._8_4_ * 0.0 + auVar71._8_4_ * 1.0;
      fVar123 = auVar73._12_4_ * 0.0 + auVar74._12_4_ * 0.0 + auVar71._12_4_ * 0.0;
      auVar73._0_4_ = auVar95._0_4_ + 0.0;
      auVar73._4_4_ = auVar95._4_4_ + 0.0;
      auVar73._8_4_ = auVar95._8_4_ + 0.0;
      auVar73._12_4_ = auVar95._12_4_ + 0.0;
      auVar71 = vshufps_avx(_local_248,_local_248,0);
      auVar177._0_4_ = fVar75 * 0.0;
      auVar177._4_4_ = fVar109 * 0.0;
      auVar177._8_4_ = fVar122 * 0.0;
      auVar177._12_4_ = fVar123 * 0.0;
      auVar95._0_4_ = auVar71._0_4_ * aVar130._0_4_ + auVar177._0_4_ + b0.field_0._0_4_ * 0.0;
      auVar95._4_4_ = auVar71._4_4_ * aVar130._4_4_ + auVar177._4_4_ + b0.field_0._4_4_ * 0.0;
      auVar95._8_4_ = auVar71._8_4_ * aVar130._8_4_ + auVar177._8_4_ + b0.field_0._8_4_ * 0.0;
      auVar95._12_4_ = auVar71._12_4_ * aVar130._12_4_ + auVar177._12_4_ + b0.field_0._12_4_ * 0.0;
      auVar71 = vshufps_avx(auVar103,auVar103,0);
      auVar74 = vshufps_avx(auVar103,auVar103,0x55);
      auVar182._0_4_ =
           auVar71._0_4_ * aVar130._0_4_ + auVar177._0_4_ + auVar74._0_4_ * b0.field_0._0_4_;
      auVar182._4_4_ =
           auVar71._4_4_ * aVar130._4_4_ + auVar177._4_4_ + auVar74._4_4_ * b0.field_0._4_4_;
      auVar182._8_4_ =
           auVar71._8_4_ * aVar130._8_4_ + auVar177._8_4_ + auVar74._8_4_ * b0.field_0._8_4_;
      auVar182._12_4_ =
           auVar71._12_4_ * aVar130._12_4_ + auVar177._12_4_ + auVar74._12_4_ * b0.field_0._12_4_;
      auVar71 = vshufps_avx(auVar89,auVar89,0x55);
      auVar184 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar74._0_4_ = auVar184._0_4_ * fVar75;
      auVar74._4_4_ = auVar184._4_4_ * fVar109;
      auVar74._8_4_ = auVar184._8_4_ * fVar122;
      auVar74._12_4_ = auVar184._12_4_ * fVar123;
      auVar94._0_4_ = auVar71._0_4_ * b0.field_0._0_4_ + auVar74._0_4_;
      auVar94._4_4_ = auVar71._4_4_ * b0.field_0._4_4_ + auVar74._4_4_;
      auVar94._8_4_ = auVar71._8_4_ * b0.field_0._8_4_ + auVar74._8_4_;
      auVar94._12_4_ = auVar71._12_4_ * b0.field_0._12_4_ + auVar74._12_4_;
      auVar71 = vshufps_avx(auVar89,auVar89,0);
      auVar184._0_4_ = auVar71._0_4_ * aVar130._0_4_ + auVar94._0_4_;
      auVar184._4_4_ = auVar71._4_4_ * aVar130._4_4_ + auVar94._4_4_;
      auVar184._8_4_ = auVar71._8_4_ * aVar130._8_4_ + auVar94._8_4_;
      auVar184._12_4_ = auVar71._12_4_ * aVar130._12_4_ + auVar94._12_4_;
      auVar58 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xaa);
      auVar185 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0x55);
      auVar71 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0);
      auVar98._0_4_ = auVar71._0_4_ * aVar130._0_4_;
      auVar98._4_4_ = auVar71._4_4_ * aVar130._4_4_;
      auVar98._8_4_ = auVar71._8_4_ * aVar130._8_4_;
      auVar98._12_4_ = auVar71._12_4_ * aVar130._12_4_;
      auVar71._0_4_ = auVar98._0_4_ + auVar185._0_4_ * b0.field_0._0_4_ + auVar58._0_4_ * fVar75;
      auVar71._4_4_ = auVar98._4_4_ + auVar185._4_4_ * b0.field_0._4_4_ + auVar58._4_4_ * fVar109;
      auVar71._8_4_ = auVar98._8_4_ + auVar185._8_4_ * b0.field_0._8_4_ + auVar58._8_4_ * fVar122;
      auVar71._12_4_ =
           auVar98._12_4_ + auVar185._12_4_ * b0.field_0._12_4_ + auVar58._12_4_ * fVar123;
      goto LAB_0155274a;
    }
    if (iVar6 < 0x9244) {
      if (iVar6 == 0x9134) {
        lVar12 = *plVar17;
        lVar20 = plVar17[2] * uVar11;
        uVar18 = *(uint *)(lVar12 + 0xc + lVar20);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar18);
        auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + lVar20)),
                                ZEXT416(*(uint *)(lVar12 + 0x10 + lVar20)),0x1c);
        auVar71 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar20)),0x28);
        auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 4 + lVar20)),
                                ZEXT416(*(uint *)(lVar12 + 0x14 + lVar20)),0x1c);
        auVar98 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar20)),0x28);
        auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 8 + lVar20)),
                                ZEXT416(*(uint *)(lVar12 + 0x18 + lVar20)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar20)),0x28);
        auVar95 = vinsertps_avx(ZEXT416(uVar18),ZEXT416(*(uint *)(lVar12 + 0x1c + lVar20)),0x1c);
        auVar94 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar20)),0x28);
      }
      else if (iVar6 == 0x9234) {
        lVar12 = *plVar17;
        lVar20 = plVar17[2] * uVar11;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *(ulong *)(lVar12 + 4 + lVar20);
        auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + lVar20)),auVar26,0x4c);
        auVar71 = vshufps_avx(auVar95,auVar95,0x78);
        auVar76._8_8_ = 0;
        auVar76._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar20);
        auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar20)),auVar76,0x4c);
        auVar98 = vshufps_avx(auVar95,auVar95,0x78);
        auVar96._8_8_ = 0;
        auVar96._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar20);
        auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar20)),auVar96,0x4c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar95,auVar95,0x78);
        auVar97._8_8_ = 0;
        auVar97._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar20);
        uVar18 = *(uint *)(lVar12 + 0x24 + lVar20);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar18);
        auVar95 = vshufps_avx(ZEXT416(uVar18),auVar97,0x4c);
        auVar94 = vshufps_avx(auVar95,auVar95,0x78);
      }
    }
    else if (iVar6 == 0xb001) {
      lVar12 = *plVar17;
      lVar20 = plVar17[2] * uVar11;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar20);
      auVar95 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(lVar12 + 8 + lVar20)),0x20);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar20);
      auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar12 + lVar20)),auVar29);
      auVar73 = vshufps_avx(auVar71,auVar29,0xd8);
      auVar126._8_8_ = 0;
      auVar126._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar20);
      auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar20)),auVar126);
      auVar182 = vshufps_avx(auVar71,auVar126,0xd8);
      fVar109 = *(float *)(lVar12 + 0x24 + lVar20);
      fVar122 = *(float *)(lVar12 + 0x28 + lVar20);
      fVar123 = *(float *)(lVar12 + 0x2c + lVar20);
      fVar93 = *(float *)(lVar12 + 0x30 + lVar20);
      auVar74 = ZEXT416((uint)fVar93);
      fVar106 = fVar93 * fVar93 + fVar123 * fVar123 + fVar109 * fVar109 + fVar122 * fVar122;
      auVar71 = vrsqrtss_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106));
      fVar107 = auVar71._0_4_;
      fVar106 = fVar107 * 1.5 + fVar107 * fVar107 * fVar107 * fVar106 * -0.5;
      auVar94 = vinsertps_avx(auVar182,ZEXT416((uint)(fVar106 * fVar109)),0x30);
      auVar71 = vinsertps_avx(auVar73,ZEXT416((uint)(fVar106 * fVar122)),0x30);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     ZEXT416((uint)(fVar106 * fVar123));
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar106 * fVar93));
      auVar73 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar20)),
                              ZEXT416(*(uint *)(lVar12 + 4 + lVar20)),0x10);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar95,ZEXT416((uint)(fVar106 * fVar93)),0x30);
      auVar95 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar20)),0x20);
      auVar98 = vinsertps_avx(auVar95,ZEXT416((uint)(fVar106 * fVar123)),0x30);
    }
    else if (iVar6 == 0x9244) {
      lVar12 = *plVar17;
      lVar20 = plVar17[2] * uVar11;
      auVar71 = *(undefined1 (*) [16])(lVar12 + lVar20);
      auVar98 = *(undefined1 (*) [16])(lVar12 + 0x10 + lVar20);
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar12 + 0x20 + lVar20))->v;
      auVar94 = *(undefined1 (*) [16])(lVar12 + 0x30 + lVar20);
    }
    lVar12 = (ulong)(iVar14 + 1) * 0x38;
    plVar17 = (long *)(lVar13 + lVar12);
    iVar6 = *(int *)(lVar13 + 0x20 + lVar12);
    if (iVar6 < 0x9244) {
      if (iVar6 == 0x9134) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 0x10 + lVar12)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar13 + 0x20 + lVar12)),0x28);
        auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 0x14 + lVar12)),0x1c);
        auVar74 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),0x28);
        auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),0x1c);
        auVar73 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar13 + 0x28 + lVar12)),0x28);
        auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 0x1c + lVar12)),0x1c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar13 + 0x2c + lVar12)),0x28);
      }
      else if (iVar6 == 0x9234) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        auVar127._8_8_ = 0;
        auVar127._0_8_ = *(ulong *)(lVar13 + 4 + lVar12);
        auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar127,0x4c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar95,auVar95,0x78);
        auVar145._8_8_ = 0;
        auVar145._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
        auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),auVar145,0x4c);
        auVar74 = vshufps_avx(auVar95,auVar95,0x78);
        auVar146._8_8_ = 0;
        auVar146._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
        auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar146,0x4c);
        auVar73 = vshufps_avx(auVar95,auVar95,0x78);
        auVar147._8_8_ = 0;
        auVar147._0_8_ = *(ulong *)(lVar13 + 0x28 + lVar12);
        auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),auVar147,0x4c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar95,auVar95,0x78);
      }
    }
    else if (iVar6 == 0xb001) {
      lVar13 = *plVar17;
      lVar12 = uVar11 * plVar17[2];
      auVar128._8_8_ = 0;
      auVar128._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
      auVar95 = vinsertps_avx(auVar128,ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),0x20);
      auVar129._8_8_ = 0;
      auVar129._0_8_ = *(ulong *)(lVar13 + 0x34 + lVar12);
      auVar74 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar129);
      auVar73 = vshufps_avx(auVar74,auVar129,0xd8);
      auVar168._8_8_ = 0;
      auVar168._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
      auVar74 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar168);
      auVar182 = vshufps_avx(auVar74,auVar168,0xd8);
      fVar109 = *(float *)(lVar13 + 0x24 + lVar12);
      fVar122 = *(float *)(lVar13 + 0x28 + lVar12);
      fVar123 = *(float *)(lVar13 + 0x2c + lVar12);
      fVar93 = *(float *)(lVar13 + 0x30 + lVar12);
      fVar106 = fVar93 * fVar93 + fVar123 * fVar123 + fVar109 * fVar109 + fVar122 * fVar122;
      auVar74 = vrsqrtss_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106));
      fVar107 = auVar74._0_4_;
      fVar106 = fVar107 * 1.5 + fVar107 * fVar107 * fVar107 * fVar106 * -0.5;
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar182,ZEXT416((uint)(fVar109 * fVar106)),0x30);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar73,ZEXT416((uint)(fVar122 * fVar106)),0x30);
      auVar74 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                              ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),0x10);
      auVar73 = vinsertps_avx(auVar95,ZEXT416((uint)(fVar93 * fVar106)),0x30);
      auVar95 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar13 + 0x3c + lVar12)),0x20);
      auVar74 = vinsertps_avx(auVar95,ZEXT416((uint)(fVar123 * fVar106)),0x30);
    }
    else if (iVar6 == 0x9244) {
      lVar13 = *plVar17;
      lVar12 = uVar11 * plVar17[2];
      a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar13 + lVar12))->v;
      auVar74 = *(undefined1 (*) [16])(lVar13 + 0x10 + lVar12);
      auVar73 = *(undefined1 (*) [16])(lVar13 + 0x20 + lVar12);
      b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar13 + 0x30 + lVar12))->v;
    }
    auVar177 = vshufps_avx(auVar89,auVar89,0);
    fVar93 = auVar177._0_4_;
    aVar130._0_4_ = fVar93 * a0_1.field_0._0_4_;
    fVar106 = auVar177._4_4_;
    aVar130._4_4_ = fVar106 * a0_1.field_0._4_4_;
    fVar107 = auVar177._8_4_;
    aVar130._8_4_ = fVar107 * a0_1.field_0._8_4_;
    fVar108 = auVar177._12_4_;
    aVar130._12_4_ = fVar108 * a0_1.field_0._12_4_;
    auVar95 = vshufps_avx(ZEXT416((uint)(1.0 - fVar75)),ZEXT416((uint)(1.0 - fVar75)),0);
    fVar75 = auVar95._0_4_;
    fVar109 = auVar95._4_4_;
    fVar122 = auVar95._8_4_;
    fVar123 = auVar95._12_4_;
    auVar95._0_4_ = fVar75 * auVar71._0_4_ + aVar130._0_4_;
    auVar95._4_4_ = fVar109 * auVar71._4_4_ + aVar130._4_4_;
    auVar95._8_4_ = fVar122 * auVar71._8_4_ + aVar130._8_4_;
    auVar95._12_4_ = fVar123 * auVar71._12_4_ + aVar130._12_4_;
    auVar182._0_4_ = fVar75 * auVar98._0_4_ + fVar93 * auVar74._0_4_;
    auVar182._4_4_ = fVar109 * auVar98._4_4_ + fVar106 * auVar74._4_4_;
    auVar182._8_4_ = fVar122 * auVar98._8_4_ + fVar107 * auVar74._8_4_;
    auVar182._12_4_ = fVar123 * auVar98._12_4_ + fVar108 * auVar74._12_4_;
    auVar184._0_4_ = fVar75 * a0.field_0._0_4_ + fVar93 * auVar73._0_4_;
    auVar184._4_4_ = fVar109 * a0.field_0._4_4_ + fVar106 * auVar73._4_4_;
    auVar184._8_4_ = fVar122 * a0.field_0._8_4_ + fVar107 * auVar73._8_4_;
    auVar184._12_4_ = fVar123 * a0.field_0._12_4_ + fVar108 * auVar73._12_4_;
    auVar71._0_4_ = fVar93 * b0.field_0._0_4_;
    auVar71._4_4_ = fVar106 * b0.field_0._4_4_;
    auVar71._8_4_ = fVar107 * b0.field_0._8_4_;
    auVar71._12_4_ = fVar108 * b0.field_0._12_4_;
    auVar98._0_4_ = fVar75 * auVar94._0_4_;
    auVar98._4_4_ = fVar109 * auVar94._4_4_;
    auVar98._8_4_ = fVar122 * auVar94._8_4_;
    auVar98._12_4_ = fVar123 * auVar94._12_4_;
    auVar185._0_4_ = auVar98._0_4_ + auVar71._0_4_;
    auVar185._4_4_ = auVar98._4_4_ + auVar71._4_4_;
    auVar185._8_4_ = auVar98._8_4_ + auVar71._8_4_;
    auVar185._12_4_ = auVar98._12_4_ + auVar71._12_4_;
  }
  uVar11 = (ulong)prim->primID_;
  if (pGVar7->numTimeSteps == 1) {
    plVar17 = *(long **)&pGVar7[1].fnumTimeSegments;
    iVar6 = (int)plVar17[4];
    if ((pGVar7->field_8).field_0x1 != '\x01') {
      if (iVar6 < 0x9244) {
        if (iVar6 == 0x9134) {
          lVar13 = *plVar17;
          lVar12 = uVar11 * plVar17[2];
          auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x10 + lVar12)),0x1c);
          aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                    vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar13 + 0x20 + lVar12)),0x28);
          auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x14 + lVar12)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),0x28);
          auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),0x1c);
          auVar94 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar13 + 0x28 + lVar12)),0x28);
          auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x1c + lVar12)),0x1c);
          auVar71 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar13 + 0x2c + lVar12)),0x28);
        }
        else if (iVar6 == 0x9234) {
          lVar13 = *plVar17;
          lVar12 = uVar11 * plVar17[2];
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)(lVar13 + 4 + lVar12);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar30,0x4c);
          aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar71,auVar71,0x78)
          ;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),auVar31,0x4c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar71,auVar71,0x78);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar32,0x4c);
          auVar94 = vshufps_avx(auVar71,auVar71,0x78);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *(ulong *)(lVar13 + 0x28 + lVar12);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),auVar33,0x4c);
          auVar71 = vshufps_avx(auVar71,auVar71,0x78);
        }
      }
      else if (iVar6 == 0xb001) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
        auVar74 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),0x20);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)(lVar13 + 0x34 + lVar12);
        auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar36);
        auVar73 = vshufps_avx(auVar71,auVar36,0xd8);
        auVar131._8_8_ = 0;
        auVar131._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
        auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar131);
        auVar58 = vshufps_avx(auVar71,auVar131,0xd8);
        fVar75 = *(float *)(lVar13 + 0x24 + lVar12);
        fVar109 = *(float *)(lVar13 + 0x28 + lVar12);
        fVar122 = *(float *)(lVar13 + 0x2c + lVar12);
        fVar123 = *(float *)(lVar13 + 0x30 + lVar12);
        fVar93 = fVar123 * fVar123 + fVar122 * fVar122 + fVar75 * fVar75 + fVar109 * fVar109;
        auVar71 = vrsqrtss_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93));
        fVar106 = auVar71._0_4_;
        fVar93 = fVar106 * 1.5 + fVar106 * fVar106 * fVar106 * fVar93 * -0.5;
        auVar71 = vinsertps_avx(auVar58,ZEXT416((uint)(fVar93 * fVar75)),0x30);
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  vinsertps_avx(auVar73,ZEXT416((uint)(fVar93 * fVar109)),0x30);
        auVar73 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),0x10);
        auVar94 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar93 * fVar123)),0x30);
        auVar74 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(lVar13 + 0x3c + lVar12)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar74,ZEXT416((uint)(fVar93 * fVar122)),0x30);
      }
      else if (iVar6 == 0x9244) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        aVar130 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                   ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar13 + lVar12))->v;
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar13 + 0x10 + lVar12))->v
        ;
        auVar94 = *(undefined1 (*) [16])(lVar13 + 0x20 + lVar12);
        auVar71 = *(undefined1 (*) [16])(lVar13 + 0x30 + lVar12);
      }
      goto LAB_01550cce;
    }
    if (iVar6 < 0x9244) {
      if (iVar6 == 0x9134) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 0x10 + lVar12)),0x1c);
        auVar94 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar13 + 0x20 + lVar12)),0x28);
        auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 0x14 + lVar12)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),0x28);
        auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),0x1c);
        auVar98 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar13 + 0x28 + lVar12)),0x28);
        auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 0x1c + lVar12)),0x1c);
        auVar71 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar13 + 0x2c + lVar12)),0x28);
      }
      else if (iVar6 == 0x9234) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)(lVar13 + 4 + lVar12);
        auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar48,0x4c);
        auVar94 = vshufps_avx(auVar71,auVar71,0x78);
        auVar49._8_8_ = 0;
        auVar49._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
        auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),auVar49,0x4c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar71,auVar71,0x78);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
        auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar50,0x4c);
        auVar98 = vshufps_avx(auVar71,auVar71,0x78);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)(lVar13 + 0x28 + lVar12);
        auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),auVar51,0x4c);
        auVar71 = vshufps_avx(auVar71,auVar71,0x78);
      }
    }
    else if (iVar6 == 0xb001) {
      lVar13 = *plVar17;
      lVar12 = uVar11 * plVar17[2];
      auVar63._8_8_ = 0;
      auVar63._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
      auVar74 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),0x20);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = *(ulong *)(lVar13 + 0x34 + lVar12);
      auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar64);
      auVar73 = vshufps_avx(auVar71,auVar64,0xd8);
      auVar138._8_8_ = 0;
      auVar138._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
      auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar138);
      auVar58 = vshufps_avx(auVar71,auVar138,0xd8);
      fVar75 = *(float *)(lVar13 + 0x24 + lVar12);
      fVar109 = *(float *)(lVar13 + 0x28 + lVar12);
      fVar122 = *(float *)(lVar13 + 0x2c + lVar12);
      fVar123 = *(float *)(lVar13 + 0x30 + lVar12);
      fVar93 = fVar123 * fVar123 + fVar122 * fVar122 + fVar75 * fVar75 + fVar109 * fVar109;
      auVar71 = vrsqrtss_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93));
      fVar106 = auVar71._0_4_;
      fVar93 = fVar106 * 1.5 + fVar106 * fVar106 * fVar106 * fVar93 * -0.5;
      auVar71 = vinsertps_avx(auVar58,ZEXT416((uint)(fVar93 * fVar75)),0x30);
      auVar94 = vinsertps_avx(auVar73,ZEXT416((uint)(fVar93 * fVar109)),0x30);
      auVar73 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                              ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),0x10);
      auVar98 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar93 * fVar123)),0x30);
      auVar74 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(lVar13 + 0x3c + lVar12)),0x20);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar74,ZEXT416((uint)(fVar93 * fVar122)),0x30);
    }
    else if (iVar6 == 0x9244) {
      lVar13 = *plVar17;
      lVar12 = uVar11 * plVar17[2];
      auVar94 = *(undefined1 (*) [16])(lVar13 + lVar12);
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar13 + 0x10 + lVar12);
      auVar98 = *(undefined1 (*) [16])(lVar13 + 0x20 + lVar12);
      auVar71 = *(undefined1 (*) [16])(lVar13 + 0x30 + lVar12);
    }
    auVar74 = vshufps_avx(auVar71,auVar71,0xff);
    auVar73 = vshufps_avx(auVar94,auVar94,0xff);
    auVar58 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
    auVar177 = vshufps_avx(auVar98,auVar98,0xff);
    fVar164 = auVar73._0_4_;
    fVar161 = auVar74._0_4_;
    fVar108 = auVar58._0_4_;
    fVar124 = auVar177._0_4_;
    fVar75 = fVar164 * fVar108 + fVar161 * fVar124;
    fVar123 = fVar164 * fVar108 - fVar161 * fVar124;
    fVar93 = fVar161 * fVar161 - fVar164 * fVar164;
    fVar106 = fVar164 * fVar124 - fVar161 * fVar108;
    fVar109 = fVar164 * fVar124 + fVar161 * fVar108;
    fVar122 = fVar108 * fVar124 + fVar164 * fVar161;
    fVar107 = fVar108 * fVar124 - fVar164 * fVar161;
    auVar74 = ZEXT416((uint)(-fVar124 * fVar124 +
                            -fVar108 * fVar108 + fVar161 * fVar161 + fVar164 * fVar164));
    auVar74 = vshufps_avx(auVar74,auVar74,0);
    auVar73 = ZEXT416((uint)(fVar75 + fVar75));
    auVar73 = vshufps_avx(auVar73,auVar73,0);
    auVar58 = ZEXT416((uint)(fVar106 + fVar106));
    auVar58 = vshufps_avx(auVar58,auVar58,0);
    fVar106 = auVar73._0_4_ * 0.0 + auVar58._0_4_ * 0.0 + auVar74._0_4_ * 1.0;
    fVar161 = auVar73._4_4_ * 1.0 + auVar58._4_4_ * 0.0 + auVar74._4_4_ * 0.0;
    fVar164 = auVar73._8_4_ * 0.0 + auVar58._8_4_ * 1.0 + auVar74._8_4_ * 0.0;
    fVar165 = auVar73._12_4_ * 0.0 + auVar58._12_4_ * 0.0 + auVar74._12_4_ * 0.0;
    auVar74 = ZEXT416((uint)(-fVar124 * fVar124 + fVar108 * fVar108 + fVar93));
    auVar74 = vshufps_avx(auVar74,auVar74,0);
    auVar73 = ZEXT416((uint)(fVar122 + fVar122));
    auVar73 = vshufps_avx(auVar73,auVar73,0);
    auVar58 = ZEXT416((uint)(fVar123 + fVar123));
    auVar58 = vshufps_avx(auVar58,auVar58,0);
    fVar122 = auVar58._0_4_ * 1.0 + auVar74._0_4_ * 0.0 + auVar73._0_4_ * 0.0;
    fVar123 = auVar58._4_4_ * 0.0 + auVar74._4_4_ * 1.0 + auVar73._4_4_ * 0.0;
    fVar166 = auVar58._8_4_ * 0.0 + auVar74._8_4_ * 0.0 + auVar73._8_4_ * 1.0;
    fVar144 = auVar58._12_4_ * 0.0 + auVar74._12_4_ * 0.0 + auVar73._12_4_ * 0.0;
    auVar74 = ZEXT416((uint)(-fVar108 * fVar108 + fVar93 + fVar124 * fVar124));
    auVar73 = vshufps_avx(auVar74,auVar74,0);
    auVar74 = ZEXT416((uint)(fVar107 + fVar107));
    auVar58 = vshufps_avx(auVar74,auVar74,0);
    auVar74 = ZEXT416((uint)(fVar109 + fVar109));
    auVar177 = vshufps_avx(auVar74,auVar74,0);
    auVar74 = vshufps_avx(auVar94,ZEXT416(0) << 0x20,0xe9);
    auVar74 = vblendps_avx(auVar74,(undefined1  [16])a0.field_0,4);
    fVar109 = auVar177._0_4_ * 1.0 + auVar58._0_4_ * 0.0 + auVar73._0_4_ * 0.0;
    fVar93 = auVar177._4_4_ * 0.0 + auVar58._4_4_ * 1.0 + auVar73._4_4_ * 0.0;
    fVar108 = auVar177._8_4_ * 0.0 + auVar58._8_4_ * 0.0 + auVar73._8_4_ * 1.0;
    fVar124 = auVar177._12_4_ * 0.0 + auVar58._12_4_ * 0.0 + auVar73._12_4_ * 0.0;
    fVar107 = auVar74._0_4_;
    fVar152 = auVar74._4_4_;
    fVar153 = auVar74._8_4_;
    fVar75 = auVar74._12_4_;
    auVar74 = vshufps_avx(auVar94,auVar94,0);
    aVar130._0_4_ = auVar74._0_4_ * fVar106 + fVar109 * 0.0 + fVar122 * 0.0;
    aVar130._4_4_ = auVar74._4_4_ * fVar161 + fVar93 * 0.0 + fVar123 * 0.0;
    aVar130._8_4_ = auVar74._8_4_ * fVar164 + fVar108 * 0.0 + fVar166 * 0.0;
    aVar130._12_4_ = auVar74._12_4_ * fVar165 + fVar124 * 0.0 + fVar144 * 0.0;
    auVar74 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0);
    auVar73 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0x55);
    a0.field_0._0_4_ = auVar74._0_4_ * fVar106 + fVar109 * 0.0 + auVar73._0_4_ * fVar122;
    a0.field_0._4_4_ = auVar74._4_4_ * fVar161 + fVar93 * 0.0 + auVar73._4_4_ * fVar123;
    a0.field_0._8_4_ = auVar74._8_4_ * fVar164 + fVar108 * 0.0 + auVar73._8_4_ * fVar166;
    a0.field_0._12_4_ = auVar74._12_4_ * fVar165 + fVar124 * 0.0 + auVar73._12_4_ * fVar144;
    auVar74 = vshufps_avx(auVar98,auVar98,0x55);
    auVar73 = vshufps_avx(auVar98,auVar98,0xaa);
    auVar58 = vshufps_avx(auVar98,auVar98,0);
    auVar94._0_4_ = auVar58._0_4_ * fVar106 + auVar73._0_4_ * fVar109 + auVar74._0_4_ * fVar122;
    auVar94._4_4_ = auVar58._4_4_ * fVar161 + auVar73._4_4_ * fVar93 + auVar74._4_4_ * fVar123;
    auVar94._8_4_ = auVar58._8_4_ * fVar164 + auVar73._8_4_ * fVar108 + auVar74._8_4_ * fVar166;
    auVar94._12_4_ = auVar58._12_4_ * fVar165 + auVar73._12_4_ * fVar124 + auVar74._12_4_ * fVar144;
    auVar74 = vshufps_avx(auVar71,auVar71,0xaa);
    auVar73 = vshufps_avx(auVar71,auVar71,0x55);
    auVar71 = vshufps_avx(auVar71,auVar71,0);
    fVar109 = auVar71._0_4_ * fVar106 + auVar73._0_4_ * fVar122 + auVar74._0_4_ * fVar109;
    fVar122 = auVar71._4_4_ * fVar161 + auVar73._4_4_ * fVar123 + auVar74._4_4_ * fVar93;
    fVar123 = auVar71._8_4_ * fVar164 + auVar73._8_4_ * fVar166 + auVar74._8_4_ * fVar108;
    fVar93 = auVar71._12_4_ * fVar165 + auVar73._12_4_ * fVar144 + auVar74._12_4_ * fVar124;
  }
  else {
    fVar75 = (pGVar7->time_range).lower;
    fVar109 = (pGVar7->time_range).upper;
    auVar58 = ZEXT416((uint)fVar109);
    fVar75 = pGVar7->fnumTimeSegments * ((query->time - fVar75) / (fVar109 - fVar75));
    auVar71 = ZEXT416((uint)fVar75);
    auVar94 = vroundss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75),9);
    auVar94 = vminss_avx(auVar94,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
    auVar85 = ZEXT816(0) << 0x20;
    auVar98 = SUB6416(ZEXT864(0),0) << 0x20;
    auVar89 = vmaxss_avx(auVar85,auVar94);
    iVar14 = (int)auVar89._0_4_;
    fVar75 = fVar75 - auVar89._0_4_;
    auVar94 = ZEXT416((uint)fVar75);
    lVar13 = *(long *)&pGVar7[1].fnumTimeSegments;
    lVar12 = CONCAT44((int)((ulong)plVar17 >> 0x20),iVar14) * 0x38;
    plVar17 = (long *)(lVar13 + lVar12);
    iVar6 = *(int *)(lVar13 + 0x20 + lVar12);
    if ((pGVar7->field_8).field_0x1 != '\x01') {
      if (iVar6 < 0x9244) {
        if (iVar6 == 0x9134) {
          lVar12 = *plVar17;
          lVar20 = plVar17[2] * uVar11;
          uVar18 = *(uint *)(lVar12 + 0xc + lVar20);
          aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar18);
          auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + lVar20)),
                                  ZEXT416(*(uint *)(lVar12 + 0x10 + lVar20)),0x1c);
          auVar71 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar20)),0x28);
          auVar58 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 4 + lVar20)),
                                  ZEXT416(*(uint *)(lVar12 + 0x14 + lVar20)),0x1c);
          auVar58 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar20)),0x28);
          auVar94 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 8 + lVar20)),
                                  ZEXT416(*(uint *)(lVar12 + 0x18 + lVar20)),0x1c);
          auVar98 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar20)),0x28);
          auVar94 = vinsertps_avx(ZEXT416(uVar18),ZEXT416(*(uint *)(lVar12 + 0x1c + lVar20)),0x1c);
          auVar89 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar20)),0x28);
        }
        else if (iVar6 == 0x9234) {
          lVar12 = *plVar17;
          lVar20 = plVar17[2] * uVar11;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)(lVar12 + 4 + lVar20);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + lVar20)),auVar34,0x4c);
          auVar71 = vshufps_avx(auVar71,auVar71,0x78);
          auVar78._8_8_ = 0;
          auVar78._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar20);
          auVar58 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar20)),auVar78,0x4c);
          auVar58 = vshufps_avx(auVar58,auVar58,0x78);
          auVar79._8_8_ = 0;
          auVar79._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar20);
          auVar94 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar20)),auVar79,0x4c);
          auVar98 = vshufps_avx(auVar94,auVar94,0x78);
          auVar80._8_8_ = 0;
          auVar80._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar20);
          uVar18 = *(uint *)(lVar12 + 0x24 + lVar20);
          aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar18);
          auVar94 = vshufps_avx(ZEXT416(uVar18),auVar80,0x4c);
          auVar89 = vshufps_avx(auVar94,auVar94,0x78);
        }
      }
      else if (iVar6 == 0xb001) {
        lVar12 = *plVar17;
        lVar20 = plVar17[2] * uVar11;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar20);
        auVar58 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(lVar12 + 8 + lVar20)),0x20);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar20);
        auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar12 + lVar20)),auVar38);
        auVar94 = vshufps_avx(auVar71,auVar38,0xd8);
        auVar132._8_8_ = 0;
        auVar132._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar20);
        auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar20)),auVar132);
        auVar98 = vshufps_avx(auVar71,auVar132,0xd8);
        fVar109 = *(float *)(lVar12 + 0x24 + lVar20);
        fVar122 = *(float *)(lVar12 + 0x28 + lVar20);
        fVar123 = *(float *)(lVar12 + 0x2c + lVar20);
        auVar73 = ZEXT416((uint)fVar123);
        fVar93 = *(float *)(lVar12 + 0x30 + lVar20);
        auVar74 = ZEXT416((uint)fVar93);
        fVar106 = fVar93 * fVar93 + fVar123 * fVar123 + fVar109 * fVar109 + fVar122 * fVar122;
        auVar71 = vrsqrtss_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106));
        fVar107 = auVar71._0_4_;
        fVar106 = fVar107 * 1.5 + fVar107 * fVar107 * fVar107 * fVar106 * -0.5;
        auVar89 = vinsertps_avx(auVar98,ZEXT416((uint)(fVar106 * fVar109)),0x30);
        auVar71 = vinsertps_avx(auVar94,ZEXT416((uint)(fVar106 * fVar122)),0x30);
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar106 * fVar123));
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     ZEXT416((uint)(fVar106 * fVar93));
        auVar94 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar20)),
                                ZEXT416(*(uint *)(lVar12 + 4 + lVar20)),0x10);
        auVar98 = vinsertps_avx(auVar58,ZEXT416((uint)(fVar106 * fVar93)),0x30);
        auVar58 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar20)),0x20);
        auVar58 = vinsertps_avx(auVar58,ZEXT416((uint)(fVar106 * fVar123)),0x30);
      }
      else if (iVar6 == 0x9244) {
        lVar12 = *plVar17;
        lVar20 = plVar17[2] * uVar11;
        auVar71 = *(undefined1 (*) [16])(lVar12 + lVar20);
        auVar58 = *(undefined1 (*) [16])(lVar12 + 0x10 + lVar20);
        auVar98 = *(undefined1 (*) [16])(lVar12 + 0x20 + lVar20);
        auVar89 = *(undefined1 (*) [16])(lVar12 + 0x30 + lVar20);
      }
      lVar12 = (ulong)(iVar14 + 1) * 0x38;
      plVar17 = (long *)(lVar13 + lVar12);
      iVar6 = *(int *)(lVar13 + 0x20 + lVar12);
      if (iVar6 < 0x9244) {
        if (iVar6 == 0x9134) {
          lVar13 = *plVar17;
          lVar12 = uVar11 * plVar17[2];
          auVar74 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x10 + lVar12)),0x1c);
          aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                    vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar13 + 0x20 + lVar12)),0x28);
          auVar74 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x14 + lVar12)),0x1c);
          auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),0x28);
          auVar73 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),0x1c);
          auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(lVar13 + 0x28 + lVar12)),0x28);
          auVar94 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                                  ZEXT416(*(uint *)(lVar13 + 0x1c + lVar12)),0x1c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar94,ZEXT416(*(uint *)(lVar13 + 0x2c + lVar12)),0x28);
        }
        else if (iVar6 == 0x9234) {
          lVar13 = *plVar17;
          lVar12 = uVar11 * plVar17[2];
          auVar133._8_8_ = 0;
          auVar133._0_8_ = *(ulong *)(lVar13 + 4 + lVar12);
          auVar74 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar133,0x4c);
          aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar74,auVar74,0x78)
          ;
          auVar148._8_8_ = 0;
          auVar148._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
          auVar74 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),auVar148,0x4c);
          auVar74 = vshufps_avx(auVar74,auVar74,0x78);
          auVar149._8_8_ = 0;
          auVar149._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
          auVar73 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar149,0x4c);
          auVar73 = vshufps_avx(auVar73,auVar73,0x78);
          auVar150._8_8_ = 0;
          auVar150._0_8_ = *(ulong *)(lVar13 + 0x28 + lVar12);
          auVar94 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),auVar150,0x4c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar94,auVar94,0x78);
        }
      }
      else if (iVar6 == 0xb001) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        auVar134._8_8_ = 0;
        auVar134._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
        auVar74 = vinsertps_avx(auVar134,ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),0x20);
        auVar135._8_8_ = 0;
        auVar135._0_8_ = *(ulong *)(lVar13 + 0x34 + lVar12);
        auVar73 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar135);
        auVar94 = vshufps_avx(auVar73,auVar135,0xd8);
        auVar169._8_8_ = 0;
        auVar169._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
        auVar73 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar169);
        auVar177 = vshufps_avx(auVar73,auVar169,0xd8);
        fVar109 = *(float *)(lVar13 + 0x24 + lVar12);
        fVar122 = *(float *)(lVar13 + 0x28 + lVar12);
        fVar123 = *(float *)(lVar13 + 0x2c + lVar12);
        fVar93 = *(float *)(lVar13 + 0x30 + lVar12);
        fVar106 = fVar93 * fVar93 + fVar123 * fVar123 + fVar109 * fVar109 + fVar122 * fVar122;
        auVar73 = vrsqrtss_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106));
        fVar107 = auVar73._0_4_;
        fVar106 = fVar107 * 1.5 + fVar107 * fVar107 * fVar107 * fVar106 * -0.5;
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar177,ZEXT416((uint)(fVar109 * fVar106)),0x30);
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  vinsertps_avx(auVar94,ZEXT416((uint)(fVar122 * fVar106)),0x30);
        auVar94 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),0x10);
        auVar73 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar93 * fVar106)),0x30);
        auVar74 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(lVar13 + 0x3c + lVar12)),0x20);
        auVar74 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar123 * fVar106)),0x30);
      }
      else if (iVar6 == 0x9244) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        aVar130 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                   ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar13 + lVar12))->v;
        auVar74 = *(undefined1 (*) [16])(lVar13 + 0x10 + lVar12);
        auVar73 = *(undefined1 (*) [16])(lVar13 + 0x20 + lVar12);
        b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar13 + 0x30 + lVar12))->v
        ;
      }
      auVar94 = vshufps_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75),0);
      fVar108 = auVar94._0_4_;
      fVar109 = aVar130.v[1];
      fVar124 = auVar94._4_4_;
      fVar122 = aVar130.v[2];
      fVar161 = auVar94._8_4_;
      fVar123 = aVar130.v[3];
      fVar164 = auVar94._12_4_;
      auVar94 = vshufps_avx(ZEXT416((uint)(1.0 - fVar75)),ZEXT416((uint)(1.0 - fVar75)),0);
      fVar75 = auVar94._0_4_;
      fVar93 = auVar94._4_4_;
      fVar106 = auVar94._8_4_;
      fVar107 = auVar94._12_4_;
      aVar130._0_4_ = fVar75 * auVar71._0_4_ + fVar108 * aVar130.v[0];
      aVar130._4_4_ = fVar93 * auVar71._4_4_ + fVar124 * fVar109;
      aVar130._8_4_ = fVar106 * auVar71._8_4_ + fVar161 * fVar122;
      aVar130._12_4_ = fVar107 * auVar71._12_4_ + fVar164 * fVar123;
      a0.field_0._0_4_ = fVar75 * auVar58._0_4_ + fVar108 * auVar74._0_4_;
      a0.field_0._4_4_ = fVar93 * auVar58._4_4_ + fVar124 * auVar74._4_4_;
      a0.field_0._8_4_ = fVar106 * auVar58._8_4_ + fVar161 * auVar74._8_4_;
      a0.field_0._12_4_ = fVar107 * auVar58._12_4_ + fVar164 * auVar74._12_4_;
      auVar94._0_4_ = fVar75 * auVar98._0_4_ + fVar108 * auVar73._0_4_;
      auVar94._4_4_ = fVar93 * auVar98._4_4_ + fVar124 * auVar73._4_4_;
      auVar94._8_4_ = fVar106 * auVar98._8_4_ + fVar161 * auVar73._8_4_;
      auVar94._12_4_ = fVar107 * auVar98._12_4_ + fVar164 * auVar73._12_4_;
      auVar71._0_4_ = fVar75 * auVar89._0_4_ + fVar108 * b0.field_0._0_4_;
      auVar71._4_4_ = fVar93 * auVar89._4_4_ + fVar124 * b0.field_0._4_4_;
      auVar71._8_4_ = fVar106 * auVar89._8_4_ + fVar161 * b0.field_0._8_4_;
      auVar71._12_4_ = fVar107 * auVar89._12_4_ + fVar164 * b0.field_0._12_4_;
      goto LAB_01550cce;
    }
    auVar71 = auVar182;
    auVar73 = auVar184;
    auVar74 = auVar185;
    if (iVar6 < 0x9244) {
      if (iVar6 == 0x9134) {
        lVar12 = *plVar17;
        lVar20 = plVar17[2] * uVar11;
        uVar18 = *(uint *)(lVar12 + 8 + lVar20);
        auVar85 = ZEXT416(uVar18);
        auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + lVar20)),
                                ZEXT416(*(uint *)(lVar12 + 0x10 + lVar20)),0x1c);
        auVar71 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar20)),0x28);
        auVar74 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 4 + lVar20)),
                                ZEXT416(*(uint *)(lVar12 + 0x14 + lVar20)),0x1c);
        auVar94 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar20)),0x28);
        auVar74 = vinsertps_avx(ZEXT416(uVar18),ZEXT416(*(uint *)(lVar12 + 0x18 + lVar20)),0x1c);
        auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar20)),0x28);
        auVar73 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar20)),
                                ZEXT416(*(uint *)(lVar12 + 0x1c + lVar20)),0x1c);
        auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar20)),0x28);
      }
      else if (iVar6 == 0x9234) {
        lVar12 = *plVar17;
        lVar20 = plVar17[2] * uVar11;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = *(ulong *)(lVar12 + 4 + lVar20);
        auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + lVar20)),auVar52,0x4c);
        auVar71 = vshufps_avx(auVar71,auVar71,0x78);
        auVar53._8_8_ = 0;
        auVar53._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar20);
        auVar74 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar20)),auVar53,0x4c);
        auVar94 = vshufps_avx(auVar74,auVar74,0x78);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar20);
        auVar74 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar20)),auVar54,0x4c);
        auVar74 = vshufps_avx(auVar74,auVar74,0x78);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar20);
        auVar73 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0x24 + lVar20)),auVar55,0x4c);
        auVar73 = vshufps_avx(auVar73,auVar73,0x78);
      }
    }
    else if (iVar6 == 0xb001) {
      lVar12 = *plVar17;
      lVar20 = plVar17[2] * uVar11;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar20);
      auVar74 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(lVar12 + 8 + lVar20)),0x20);
      auVar86._8_8_ = 0;
      auVar86._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar20);
      auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar12 + lVar20)),auVar86);
      auVar58 = vshufps_avx(auVar71,auVar86,0xd8);
      auVar139._8_8_ = 0;
      auVar139._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar20);
      auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar20)),auVar139);
      auVar73 = vshufps_avx(auVar71,auVar139,0xd8);
      fVar109 = *(float *)(lVar12 + 0x24 + lVar20);
      fVar122 = *(float *)(lVar12 + 0x28 + lVar20);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)fVar122);
      fVar123 = *(float *)(lVar12 + 0x2c + lVar20);
      fVar93 = *(float *)(lVar12 + 0x30 + lVar20);
      fVar106 = fVar93 * fVar93 + fVar123 * fVar123 + fVar109 * fVar109 + fVar122 * fVar122;
      auVar71 = vrsqrtss_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106));
      fVar107 = auVar71._0_4_;
      auVar177 = ZEXT416((uint)(fVar107 * fVar107));
      fVar106 = fVar107 * 1.5 + fVar107 * fVar107 * fVar107 * fVar106 * -0.5;
      aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar106 * fVar109));
      auVar73 = vinsertps_avx(auVar73,ZEXT416((uint)(fVar106 * fVar109)),0x30);
      auVar71 = vinsertps_avx(auVar58,ZEXT416((uint)(fVar106 * fVar122)),0x30);
      auVar85 = ZEXT416((uint)(fVar106 * fVar93));
      auVar58 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar20)),
                              ZEXT416(*(uint *)(lVar12 + 4 + lVar20)),0x10);
      auVar74 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar106 * fVar93)),0x30);
      auVar58 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar20)),0x20);
      auVar94 = vinsertps_avx(auVar58,ZEXT416((uint)(fVar106 * fVar123)),0x30);
    }
    else if (iVar6 == 0x9244) {
      lVar12 = *plVar17;
      lVar20 = plVar17[2] * uVar11;
      auVar71 = *(undefined1 (*) [16])(lVar12 + lVar20);
      auVar94 = *(undefined1 (*) [16])(lVar12 + 0x10 + lVar20);
      auVar74 = *(undefined1 (*) [16])(lVar12 + 0x20 + lVar20);
      auVar73 = *(undefined1 (*) [16])(lVar12 + 0x30 + lVar20);
    }
    lVar12 = (ulong)(iVar14 + 1) * 0x38;
    plVar17 = (long *)(lVar13 + lVar12);
    iVar6 = *(int *)(lVar13 + 0x20 + lVar12);
    if (iVar6 < 0x9244) {
      if (iVar6 == 0x9134) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        auVar58 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 0x10 + lVar12)),0x1c);
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  vinsertps_avx(auVar58,ZEXT416(*(uint *)(lVar13 + 0x20 + lVar12)),0x28);
        auVar58 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 0x14 + lVar12)),0x1c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar58,ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),0x28);
        auVar58 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),0x1c);
        auVar85 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(lVar13 + 0x28 + lVar12)),0x28);
        auVar58 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                                ZEXT416(*(uint *)(lVar13 + 0x1c + lVar12)),0x1c);
        auVar177 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(lVar13 + 0x2c + lVar12)),0x28);
      }
      else if (iVar6 == 0x9234) {
        lVar13 = *plVar17;
        lVar12 = uVar11 * plVar17[2];
        auVar66._8_8_ = 0;
        auVar66._0_8_ = *(ulong *)(lVar13 + 4 + lVar12);
        auVar58 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar66,0x4c);
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar58,auVar58,0x78);
        auVar67._8_8_ = 0;
        auVar67._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
        auVar58 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),auVar67,0x4c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar58,auVar58,0x78);
        auVar68._8_8_ = 0;
        auVar68._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
        auVar58 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar68,0x4c);
        auVar85 = vshufps_avx(auVar58,auVar58,0x78);
        auVar69._8_8_ = 0;
        auVar69._0_8_ = *(ulong *)(lVar13 + 0x28 + lVar12);
        auVar58 = vshufps_avx(ZEXT416(*(uint *)(lVar13 + 0x24 + lVar12)),auVar69,0x4c);
        auVar177 = vshufps_avx(auVar58,auVar58,0x78);
      }
    }
    else if (iVar6 == 0xb001) {
      lVar13 = *plVar17;
      lVar12 = uVar11 * plVar17[2];
      auVar72._8_8_ = 0;
      auVar72._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar12);
      auVar58 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(lVar13 + 8 + lVar12)),0x20);
      auVar90._8_8_ = 0;
      auVar90._0_8_ = *(ulong *)(lVar13 + 0x34 + lVar12);
      auVar98 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + lVar12)),auVar90);
      auVar89 = vshufps_avx(auVar98,auVar90,0xd8);
      auVar142._8_8_ = 0;
      auVar142._0_8_ = *(ulong *)(lVar13 + 0x1c + lVar12);
      auVar98 = vmovlhps_avx(ZEXT416(*(uint *)(lVar13 + 0x18 + lVar12)),auVar142);
      auVar177 = vshufps_avx(auVar98,auVar142,0xd8);
      fVar109 = *(float *)(lVar13 + 0x24 + lVar12);
      fVar122 = *(float *)(lVar13 + 0x28 + lVar12);
      fVar123 = *(float *)(lVar13 + 0x2c + lVar12);
      fVar93 = *(float *)(lVar13 + 0x30 + lVar12);
      fVar106 = fVar93 * fVar93 + fVar123 * fVar123 + fVar109 * fVar109 + fVar122 * fVar122;
      auVar98 = vrsqrtss_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106));
      fVar107 = auVar98._0_4_;
      fVar106 = fVar107 * 1.5 + fVar107 * fVar107 * fVar107 * fVar106 * -0.5;
      auVar177 = vinsertps_avx(auVar177,ZEXT416((uint)(fVar106 * fVar109)),0x30);
      aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                vinsertps_avx(auVar89,ZEXT416((uint)(fVar106 * fVar122)),0x30);
      auVar98 = vinsertps_avx(ZEXT416(*(uint *)(lVar13 + 0xc + lVar12)),
                              ZEXT416(*(uint *)(lVar13 + 4 + lVar12)),0x10);
      auVar85 = vinsertps_avx(auVar58,ZEXT416((uint)(fVar106 * fVar93)),0x30);
      auVar58 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(lVar13 + 0x3c + lVar12)),0x20);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar58,ZEXT416((uint)(fVar106 * fVar123)),0x30);
    }
    else if (iVar6 == 0x9244) {
      lVar13 = *plVar17;
      lVar12 = uVar11 * plVar17[2];
      aVar130 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                 ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar13 + lVar12))->v;
      b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar13 + 0x10 + lVar12))->v;
      auVar85 = *(undefined1 (*) [16])(lVar13 + 0x20 + lVar12);
      auVar177 = *(undefined1 (*) [16])(lVar13 + 0x30 + lVar12);
    }
    auVar58 = vshufps_avx(auVar73,auVar73,0xff);
    auVar98 = vshufps_avx(auVar71,auVar71,0xff);
    auVar89 = vshufps_avx(auVar94,auVar94,0xff);
    auVar137 = vshufps_avx(auVar74,auVar74,0xff);
    auVar44 = vshufps_avx(auVar177,auVar177,0xff);
    auVar45 = vshufps_avx((undefined1  [16])aVar130,(undefined1  [16])aVar130,0xff);
    auVar46 = vshufps_avx((undefined1  [16])b0.field_0,(undefined1  [16])b0.field_0,0xff);
    local_238 = vshufps_avx(auVar85,auVar85,0xff);
    fVar122 = auVar98._0_4_;
    fVar123 = auVar58._0_4_;
    fVar106 = auVar89._0_4_;
    fVar93 = auVar137._0_4_;
    fVar109 = fVar93 * local_238._0_4_ +
              fVar106 * auVar46._0_4_ + auVar44._0_4_ * fVar123 + auVar45._0_4_ * fVar122;
    auVar91._0_4_ = -fVar109;
    auVar91._4_4_ = 0x80000000;
    auVar91._8_4_ = 0x80000000;
    auVar91._12_4_ = 0x80000000;
    auVar118._0_8_ = local_238._0_8_ ^ 0x8000000080000000;
    auVar118._8_4_ = local_238._8_4_ ^ 0x80000000;
    auVar118._12_4_ = local_238._12_4_ ^ 0x80000000;
    if (fVar109 < auVar91._0_4_) {
      auVar181._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
      auVar181._8_4_ = auVar44._8_4_ ^ 0x80000000;
      auVar181._12_4_ = auVar44._12_4_ ^ 0x80000000;
      auVar171._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
      auVar171._8_4_ = auVar45._8_4_ ^ 0x80000000;
      auVar171._12_4_ = auVar45._12_4_ ^ 0x80000000;
      auVar44 = auVar181;
      auVar45 = auVar171;
      local_238 = auVar118;
    }
    auVar104._8_4_ = 0x7fffffff;
    auVar104._0_8_ = 0x7fffffff7fffffff;
    auVar104._12_4_ = 0x7fffffff;
    auVar58 = vandps_avx(ZEXT416((uint)fVar109),auVar104);
    fVar108 = auVar58._0_4_;
    auVar119._0_8_ = auVar46._0_8_ ^ 0x8000000080000000;
    auVar119._8_4_ = auVar46._8_4_ ^ 0x80000000;
    auVar119._12_4_ = auVar46._12_4_ ^ 0x80000000;
    auVar98 = vcmpss_avx(ZEXT416((uint)fVar109),auVar91,1);
    auVar89 = vmaxss_avx(auVar91,ZEXT416((uint)fVar109));
    fVar107 = auVar89._0_4_;
    fVar109 = 1.0 - fVar108;
    if (fVar109 < 0.0) {
      local_c8 = auVar98;
      local_b8 = auVar119;
      local_a8 = auVar58;
      fVar109 = sqrtf(fVar109);
      auVar98 = local_c8;
      auVar58 = local_a8;
      auVar119 = local_b8;
    }
    else {
      auVar89 = vsqrtss_avx(ZEXT416((uint)fVar109),ZEXT416((uint)fVar109));
      fVar109 = auVar89._0_4_;
    }
    auVar98 = vblendvps_avx(auVar46,auVar119,auVar98);
    auVar137 = vmaxss_avx(ZEXT816(0) << 0x40,
                          ZEXT416((uint)(1.5707964 -
                                        fVar109 * (fVar108 * (fVar108 * (fVar108 * (fVar108 * (
                                                  fVar108 * -0.0043095737 + 0.0192803) + -0.04489909
                                                  ) + 0.08785567) + -0.21450998) + 1.5707952))));
    auVar120._0_8_ = auVar137._0_8_ ^ 0x8000000080000000;
    auVar120._8_4_ = auVar137._8_4_ ^ 0x80000000;
    auVar120._12_4_ = auVar137._12_4_ ^ 0x80000000;
    auVar89 = vcmpss_avx(ZEXT416((uint)fVar107),ZEXT816(0) << 0x40,1);
    auVar89 = vblendvps_avx(auVar137,auVar120,auVar89);
    auVar58 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar58,1);
    auVar143._8_4_ = 0x7fc00000;
    auVar143._0_8_ = 0x7fc000007fc00000;
    auVar143._12_4_ = 0x7fc00000;
    auVar58 = vblendvps_avx(ZEXT416((uint)(1.5707964 - auVar89._0_4_)),auVar143,auVar58);
    fVar124 = fVar75 * auVar58._0_4_;
    auVar58 = ZEXT416((uint)(fVar124 * 0.63661975));
    auVar58 = vroundss_avx(auVar58,auVar58,9);
    uVar15 = (uint)auVar58._0_4_;
    fVar124 = fVar124 - auVar58._0_4_ * 1.5707964;
    fVar108 = fVar124 * fVar124;
    uVar18 = uVar15 & 3;
    fVar109 = fVar108 * (fVar108 * (fVar108 * (fVar108 * (fVar108 * -2.5963018e-07 + 2.4756235e-05)
                                              + -0.001388833) + 0.04166664) + -0.5) + 1.0;
    fVar124 = fVar124 * (fVar108 * (fVar108 * (fVar108 * (fVar108 * (fVar108 * -2.5029328e-08 +
                                                                    2.7600126e-06) + -0.00019842605)
                                              + 0.008333348) + -0.16666667) + 1.0);
    fVar108 = fVar109;
    if ((uVar15 & 1) != 0) {
      fVar108 = fVar124;
      fVar124 = fVar109;
    }
    if (uVar18 - 1 < 2) {
      fVar108 = -fVar108;
    }
    fVar161 = fVar123 * fVar107 - auVar44._0_4_;
    fVar164 = fVar122 * fVar107 - auVar45._0_4_;
    fVar165 = fVar107 * fVar106 - auVar98._0_4_;
    fVar166 = fVar107 * fVar93 - (float)local_238._0_4_;
    fVar109 = fVar166 * fVar166 + fVar165 * fVar165 + fVar161 * fVar161 + fVar164 * fVar164;
    auVar58 = vrsqrtss_avx(ZEXT416((uint)fVar109),ZEXT416((uint)fVar109));
    fVar144 = auVar58._0_4_;
    fVar109 = fVar144 * 1.5 + fVar144 * fVar144 * fVar144 * fVar109 * -0.5;
    if (uVar18 < 2) {
      fVar124 = -fVar124;
    }
    fVar158 = 1.0 - fVar75;
    fVar153 = fVar123 * fVar158 + fVar75 * auVar44._0_4_;
    fVar154 = fVar122 * fVar158 + fVar75 * auVar45._0_4_;
    fVar155 = fVar158 * fVar106 + fVar75 * auVar98._0_4_;
    fVar144 = fVar93 * fVar158 + fVar75 * (float)local_238._0_4_;
    fVar152 = fVar144 * fVar144 + fVar155 * fVar155 + fVar153 * fVar153 + fVar154 * fVar154;
    auVar58 = vrsqrtss_avx(ZEXT416((uint)fVar152),ZEXT416((uint)fVar152));
    fVar159 = auVar58._0_4_;
    fVar152 = fVar159 * 1.5 + fVar159 * fVar159 * fVar159 * fVar152 * -0.5;
    if (0.9995 < fVar107) {
      fVar153 = fVar153 * fVar152;
      fVar154 = fVar154 * fVar152;
      fVar155 = fVar155 * fVar152;
    }
    else {
      fVar153 = fVar108 * fVar123 + fVar109 * fVar161 * fVar124;
      fVar154 = fVar108 * fVar122 + fVar109 * fVar164 * fVar124;
      fVar155 = fVar106 * fVar108 + fVar109 * fVar165 * fVar124;
    }
    local_138 = auVar94._0_4_;
    fStack_134 = auVar94._4_4_;
    fStack_130 = auVar94._8_4_;
    fStack_12c = auVar94._12_4_;
    auVar58 = vcmpss_avx(SUB6416(ZEXT464(0x3f7fdf3b),0),ZEXT416((uint)fVar107),1);
    auVar58 = vblendvps_avx(ZEXT416((uint)(fVar93 * fVar108 + fVar109 * fVar166 * fVar124)),
                            ZEXT416((uint)(fVar152 * fVar144)),auVar58);
    auVar94 = vpermilps_avx(ZEXT416((uint)fVar75),0);
    local_118 = aVar130.v[0];
    fStack_114 = aVar130.v[1];
    fStack_110 = aVar130.v[2];
    fStack_10c = aVar130.v[3];
    fVar75 = auVar94._0_4_;
    fVar109 = auVar94._4_4_;
    fVar122 = auVar94._8_4_;
    fVar123 = auVar94._12_4_;
    auVar94 = vshufps_avx(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),0);
    local_148 = auVar71._0_4_;
    fStack_144 = auVar71._4_4_;
    fStack_140 = auVar71._8_4_;
    fStack_13c = auVar71._12_4_;
    fVar93 = auVar94._0_4_;
    fVar106 = auVar94._4_4_;
    fVar107 = auVar94._8_4_;
    fVar108 = auVar94._12_4_;
    auVar121._0_4_ = fVar93 * local_148 + fVar75 * local_118;
    auVar121._4_4_ = fVar106 * fStack_144 + fVar109 * fStack_114;
    auVar121._8_4_ = fVar107 * fStack_140 + fVar122 * fStack_110;
    auVar121._12_4_ = fVar108 * fStack_13c + fVar123 * fStack_10c;
    local_168 = b0.field_0._0_4_;
    fStack_164 = b0.field_0._4_4_;
    fStack_160 = b0.field_0._8_4_;
    fStack_15c = b0.field_0._12_4_;
    auVar105._0_4_ = local_138 * fVar93 + fVar75 * local_168;
    auVar105._4_4_ = fStack_134 * fVar106 + fVar109 * fStack_164;
    auVar105._8_4_ = fStack_130 * fVar107 + fVar122 * fStack_160;
    auVar105._12_4_ = fStack_12c * fVar108 + fVar123 * fStack_15c;
    local_158 = auVar85._0_4_;
    fStack_154 = auVar85._4_4_;
    fStack_150 = auVar85._8_4_;
    fStack_14c = auVar85._12_4_;
    local_108 = auVar74._0_4_;
    fStack_104 = auVar74._4_4_;
    fStack_100 = auVar74._8_4_;
    fStack_fc = auVar74._12_4_;
    auVar92._0_4_ = fVar93 * local_108 + fVar75 * local_158;
    auVar92._4_4_ = fVar106 * fStack_104 + fVar109 * fStack_154;
    auVar92._8_4_ = fVar107 * fStack_100 + fVar122 * fStack_150;
    auVar92._12_4_ = fVar108 * fStack_fc + fVar123 * fStack_14c;
    local_128 = auVar177._0_4_;
    fStack_124 = auVar177._4_4_;
    fStack_120 = auVar177._8_4_;
    fStack_11c = auVar177._12_4_;
    local_f8 = auVar73._0_4_;
    fStack_f4 = auVar73._4_4_;
    fStack_f0 = auVar73._8_4_;
    fStack_ec = auVar73._12_4_;
    local_258._4_4_ = fVar106 * fStack_f4 + fVar109 * fStack_124;
    local_258._0_4_ = fVar93 * local_f8 + fVar75 * local_128;
    fStack_250 = fVar107 * fStack_f0 + fVar122 * fStack_120;
    fStack_24c = fVar108 * fStack_ec + fVar123 * fStack_11c;
    fVar152 = auVar58._0_4_;
    fVar75 = fVar154 * fVar155 + fVar152 * fVar153;
    fVar123 = fVar154 * fVar155 - fVar152 * fVar153;
    fVar93 = fVar153 * fVar153 - fVar154 * fVar154;
    fVar106 = fVar152 * fVar154 - fVar153 * fVar155;
    fVar109 = fVar152 * fVar154 + fVar153 * fVar155;
    fVar122 = fVar152 * fVar155 + fVar153 * fVar154;
    fVar107 = fVar152 * fVar155 - fVar153 * fVar154;
    auVar71 = ZEXT416((uint)(-fVar152 * fVar152 +
                            -fVar155 * fVar155 + fVar153 * fVar153 + fVar154 * fVar154));
    auVar71 = vshufps_avx(auVar71,auVar71,0);
    auVar74 = ZEXT416((uint)(fVar75 + fVar75));
    auVar74 = vshufps_avx(auVar74,auVar74,0);
    auVar73 = ZEXT416((uint)(fVar106 + fVar106));
    auVar73 = vshufps_avx(auVar73,auVar73,0);
    fVar106 = auVar71._0_4_ * 1.0 + auVar74._0_4_ * 0.0 + auVar73._0_4_ * 0.0;
    fVar108 = auVar71._4_4_ * 0.0 + auVar74._4_4_ * 1.0 + auVar73._4_4_ * 0.0;
    fVar124 = auVar71._8_4_ * 0.0 + auVar74._8_4_ * 0.0 + auVar73._8_4_ * 1.0;
    fVar161 = auVar71._12_4_ * 0.0 + auVar74._12_4_ * 0.0 + auVar73._12_4_ * 0.0;
    auVar71 = ZEXT416((uint)(-fVar152 * fVar152 + fVar155 * fVar155 + fVar93));
    auVar71 = vshufps_avx(auVar71,auVar71,0);
    auVar74 = ZEXT416((uint)(fVar122 + fVar122));
    auVar74 = vshufps_avx(auVar74,auVar74,0);
    auVar73 = ZEXT416((uint)(fVar123 + fVar123));
    auVar73 = vshufps_avx(auVar73,auVar73,0);
    fVar164 = auVar73._0_4_ * 1.0 + auVar74._0_4_ * 0.0 + auVar71._0_4_ * 0.0;
    fVar165 = auVar73._4_4_ * 0.0 + auVar74._4_4_ * 0.0 + auVar71._4_4_ * 1.0;
    fVar166 = auVar73._8_4_ * 0.0 + auVar74._8_4_ * 1.0 + auVar71._8_4_ * 0.0;
    fVar144 = auVar73._12_4_ * 0.0 + auVar74._12_4_ * 0.0 + auVar71._12_4_ * 0.0;
    auVar71 = ZEXT416((uint)(fVar152 * fVar152 + -fVar155 * fVar155 + fVar93));
    auVar74 = vshufps_avx(auVar71,auVar71,0);
    auVar71 = ZEXT416((uint)(fVar107 + fVar107));
    auVar73 = vshufps_avx(auVar71,auVar71,0);
    auVar71 = ZEXT416((uint)(fVar109 + fVar109));
    auVar58 = vshufps_avx(auVar71,auVar71,0);
    auVar71 = vshufps_avx(auVar121,ZEXT416(0) << 0x20,0xe9);
    auVar71 = vblendps_avx(auVar71,auVar105,4);
    fVar109 = auVar58._0_4_ * 1.0 + auVar73._0_4_ * 0.0 + auVar74._0_4_ * 0.0;
    fVar122 = auVar58._4_4_ * 0.0 + auVar73._4_4_ * 1.0 + auVar74._4_4_ * 0.0;
    fVar123 = auVar58._8_4_ * 0.0 + auVar73._8_4_ * 0.0 + auVar74._8_4_ * 1.0;
    fVar93 = auVar58._12_4_ * 0.0 + auVar73._12_4_ * 0.0 + auVar74._12_4_ * 0.0;
    fVar107 = auVar71._0_4_;
    fVar152 = auVar71._4_4_;
    fVar153 = auVar71._8_4_;
    fVar75 = auVar71._12_4_;
    auVar71 = vshufps_avx(auVar121,auVar121,0);
    aVar130._0_4_ = auVar71._0_4_ * fVar106 + fVar109 * 0.0 + fVar164 * 0.0;
    aVar130._4_4_ = auVar71._4_4_ * fVar108 + fVar122 * 0.0 + fVar165 * 0.0;
    aVar130._8_4_ = auVar71._8_4_ * fVar124 + fVar123 * 0.0 + fVar166 * 0.0;
    aVar130._12_4_ = auVar71._12_4_ * fVar161 + fVar93 * 0.0 + fVar144 * 0.0;
    auVar71 = vshufps_avx(auVar105,auVar105,0);
    auVar74 = vshufps_avx(auVar105,auVar105,0x55);
    a0.field_0._0_4_ = auVar71._0_4_ * fVar106 + fVar109 * 0.0 + auVar74._0_4_ * fVar164;
    a0.field_0._4_4_ = auVar71._4_4_ * fVar108 + fVar122 * 0.0 + auVar74._4_4_ * fVar165;
    a0.field_0._8_4_ = auVar71._8_4_ * fVar124 + fVar123 * 0.0 + auVar74._8_4_ * fVar166;
    a0.field_0._12_4_ = auVar71._12_4_ * fVar161 + fVar93 * 0.0 + auVar74._12_4_ * fVar144;
    auVar71 = vshufps_avx(auVar92,auVar92,0x55);
    auVar74 = vshufps_avx(auVar92,auVar92,0xaa);
    auVar73 = vshufps_avx(auVar92,auVar92,0);
    auVar94._0_4_ = auVar73._0_4_ * fVar106 + auVar71._0_4_ * fVar164 + auVar74._0_4_ * fVar109;
    auVar94._4_4_ = auVar73._4_4_ * fVar108 + auVar71._4_4_ * fVar165 + auVar74._4_4_ * fVar122;
    auVar94._8_4_ = auVar73._8_4_ * fVar124 + auVar71._8_4_ * fVar166 + auVar74._8_4_ * fVar123;
    auVar94._12_4_ = auVar73._12_4_ * fVar161 + auVar71._12_4_ * fVar144 + auVar74._12_4_ * fVar93;
    auVar71 = vshufps_avx(_local_258,_local_258,0xaa);
    auVar74 = vshufps_avx(_local_258,_local_258,0x55);
    auVar73 = vshufps_avx(_local_258,_local_258,0);
    fVar109 = auVar73._0_4_ * fVar106 + auVar74._0_4_ * fVar164 + auVar71._0_4_ * fVar109;
    fVar122 = auVar73._4_4_ * fVar108 + auVar74._4_4_ * fVar165 + auVar71._4_4_ * fVar122;
    fVar123 = auVar73._8_4_ * fVar124 + auVar74._8_4_ * fVar166 + auVar71._8_4_ * fVar123;
    fVar93 = auVar73._12_4_ * fVar161 + auVar74._12_4_ * fVar144 + auVar71._12_4_ * fVar93;
  }
  auVar71._0_4_ = fVar107 + 0.0 + fVar109;
  auVar71._4_4_ = fVar152 + 0.0 + fVar122;
  auVar71._8_4_ = fVar153 + 0.0 + fVar123;
  auVar71._12_4_ = fVar75 + 0.0 + fVar93;
LAB_01550cce:
  auVar74 = vshufps_avx(auVar94,auVar94,0xc9);
  auVar73 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
  auVar156._0_4_ = auVar94._0_4_ * auVar73._0_4_;
  auVar156._4_4_ = auVar94._4_4_ * auVar73._4_4_;
  auVar156._8_4_ = auVar94._8_4_ * auVar73._8_4_;
  auVar156._12_4_ = auVar94._12_4_ * auVar73._12_4_;
  auVar162._0_4_ = a0.field_0._0_4_ * auVar74._0_4_;
  auVar162._4_4_ = a0.field_0._4_4_ * auVar74._4_4_;
  auVar162._8_4_ = a0.field_0._8_4_ * auVar74._8_4_;
  auVar162._12_4_ = a0.field_0._12_4_ * auVar74._12_4_;
  auVar177 = vsubps_avx(auVar162,auVar156);
  auVar58 = vshufps_avx(auVar177,auVar177,0xc9);
  auVar98 = vshufps_avx((undefined1  [16])aVar130,(undefined1  [16])aVar130,0xc9);
  auVar81._0_4_ = auVar74._0_4_ * aVar130.v[0];
  auVar81._4_4_ = auVar74._4_4_ * aVar130.v[1];
  auVar81._8_4_ = auVar74._8_4_ * aVar130.v[2];
  auVar81._12_4_ = auVar74._12_4_ * aVar130.v[3];
  auVar99._0_4_ = auVar98._0_4_ * auVar94._0_4_;
  auVar99._4_4_ = auVar98._4_4_ * auVar94._4_4_;
  auVar99._8_4_ = auVar98._8_4_ * auVar94._8_4_;
  auVar99._12_4_ = auVar98._12_4_ * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar99,auVar81);
  auVar100._0_4_ = auVar98._0_4_ * a0.field_0._0_4_;
  auVar100._4_4_ = auVar98._4_4_ * a0.field_0._4_4_;
  auVar100._8_4_ = auVar98._8_4_ * a0.field_0._8_4_;
  auVar100._12_4_ = auVar98._12_4_ * a0.field_0._12_4_;
  auVar110._0_4_ = aVar130.v[0] * auVar73._0_4_;
  auVar110._4_4_ = aVar130.v[1] * auVar73._4_4_;
  auVar110._8_4_ = aVar130.v[2] * auVar73._8_4_;
  auVar110._12_4_ = aVar130.v[3] * auVar73._12_4_;
  auVar73 = vsubps_avx(auVar110,auVar100);
  auVar74 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar98 = vunpcklps_avx(auVar58,auVar74);
  auVar74 = vunpcklps_avx(auVar177,auVar73);
  auVar73 = vinsertps_avx(auVar94,auVar94,0x4a);
  auVar94 = vunpcklps_avx(auVar74,ZEXT416(auVar94._0_4_));
  auVar177 = vunpcklps_avx(auVar98,auVar73);
  auVar74 = vdpps_avx((undefined1  [16])aVar130,auVar58,0x7f);
  auVar73 = vunpckhps_avx(auVar98,auVar73);
  auVar58 = vshufps_avx(auVar74,auVar74,0);
  auVar74 = vdivps_avx(auVar177,auVar58);
  auVar73 = vdivps_avx(auVar73,auVar58);
  auVar58 = vdivps_avx(auVar94,auVar58);
  auVar94 = vshufps_avx(auVar71,auVar71,0);
  auVar98 = vshufps_avx(auVar71,auVar71,0x55);
  auVar71 = vshufps_avx(auVar71,auVar71,0xaa);
  auVar178._0_4_ =
       auVar94._0_4_ * auVar74._0_4_ + auVar73._0_4_ * auVar98._0_4_ + auVar58._0_4_ * auVar71._0_4_
  ;
  auVar178._4_4_ =
       auVar94._4_4_ * auVar74._4_4_ + auVar73._4_4_ * auVar98._4_4_ + auVar58._4_4_ * auVar71._4_4_
  ;
  auVar178._8_4_ =
       auVar94._8_4_ * auVar74._8_4_ + auVar73._8_4_ * auVar98._8_4_ + auVar58._8_4_ * auVar71._8_4_
  ;
  auVar178._12_4_ =
       auVar94._12_4_ * auVar74._12_4_ +
       auVar73._12_4_ * auVar98._12_4_ + auVar58._12_4_ * auVar71._12_4_;
  auVar157._8_4_ = 0x80000000;
  auVar157._0_8_ = 0x8000000080000000;
  auVar157._12_4_ = 0x80000000;
  uVar19 = 2;
  bVar9 = true;
  local_68 = 0.0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar71 = vdpps_avx(auVar74,auVar73,0x7f);
    auVar101._8_4_ = 0x7fffffff;
    auVar101._0_8_ = 0x7fffffff7fffffff;
    auVar101._12_4_ = 0x7fffffff;
    auVar71 = vandps_avx(auVar71,auVar101);
    if (auVar71._0_4_ <= 1e-05) {
      auVar71 = vdpps_avx(auVar74,auVar58,0x7f);
      auVar71 = vandps_avx(auVar71,auVar101);
      if (auVar71._0_4_ <= 1e-05) {
        auVar71 = vdpps_avx(auVar73,auVar58,0x7f);
        auVar71 = vandps_avx(auVar71,auVar101);
        if (auVar71._0_4_ <= 1e-05) {
          auVar94 = vdpps_avx(auVar74,auVar74,0x7f);
          auVar98 = vdpps_avx(auVar73,auVar73,0x7f);
          fVar75 = auVar94._0_4_;
          auVar71 = vandps_avx(ZEXT416((uint)(fVar75 - auVar98._0_4_)),auVar101);
          if (auVar71._0_4_ <= 1e-05) {
            auVar177 = vdpps_avx(auVar58,auVar58,0x7f);
            auVar71 = vandps_avx(ZEXT416((uint)(fVar75 - auVar177._0_4_)),auVar101);
            if ((auVar71._0_4_ <= 1e-05) &&
               (auVar71 = vandps_avx(ZEXT416((uint)(auVar98._0_4_ - auVar177._0_4_)),auVar101),
               auVar71._0_4_ <= 1e-05)) {
              uVar19 = 1;
              if (fVar75 < 0.0) {
                local_68 = sqrtf(fVar75);
                auVar157._8_4_ = 0x80000000;
                auVar157._0_8_ = 0x8000000080000000;
                auVar157._12_4_ = 0x80000000;
              }
              else {
                auVar71 = vsqrtss_avx(auVar94,auVar94);
                local_68 = auVar71._0_4_;
              }
              bVar9 = false;
            }
          }
        }
      }
    }
  }
  pRVar8 = context->userContext;
  uVar18 = pRVar8->instStackSize;
  auVar82._8_8_ = 0;
  auVar82._0_4_ = prim->primID_;
  auVar82._4_4_ = prim->instID_;
  auVar71 = vshufps_avx(auVar82,auVar82,0xe1);
  uVar5 = vmovlps_avx(auVar71);
  *(undefined8 *)(pRVar8->instID + uVar18) = uVar5;
  *(undefined1 (*) [16])pRVar8->world2inst[uVar18] = auVar74;
  *(undefined1 (*) [16])(pRVar8->world2inst[uVar18] + 4) = auVar73;
  *(undefined1 (*) [16])(pRVar8->world2inst[uVar18] + 8) = auVar58;
  pfVar1 = pRVar8->world2inst[uVar18] + 0xc;
  *pfVar1 = -auVar178._0_4_;
  pfVar1[1] = -auVar178._4_4_;
  pfVar1[2] = -auVar178._8_4_;
  pfVar1[3] = -auVar178._12_4_;
  *(undefined1 (*) [16])pRVar8->inst2world[uVar18] = auVar95;
  *(undefined1 (*) [16])(pRVar8->inst2world[uVar18] + 4) = auVar182;
  *(undefined1 (*) [16])(pRVar8->inst2world[uVar18] + 8) = auVar184;
  *(undefined1 (*) [16])(pRVar8->inst2world[uVar18] + 0xc) = auVar185;
  pRVar8->instStackSize = pRVar8->instStackSize + 1;
  local_dc = query->time;
  fVar75 = (query->p).field_0.field_0.x;
  fVar109 = (query->p).field_0.field_0.y;
  fVar122 = (query->p).field_0.field_0.z;
  auVar111._0_4_ = auVar58._0_4_ * fVar122;
  auVar111._4_4_ = auVar58._4_4_ * fVar122;
  auVar111._8_4_ = auVar58._8_4_ * fVar122;
  auVar111._12_4_ = auVar58._12_4_ * fVar122;
  auVar95 = vsubps_avx(auVar111,auVar178);
  auVar83._0_4_ = auVar74._0_4_ * fVar75 + auVar73._0_4_ * fVar109 + auVar95._0_4_;
  auVar83._4_4_ = auVar74._4_4_ * fVar75 + auVar73._4_4_ * fVar109 + auVar95._4_4_;
  auVar83._8_4_ = auVar74._8_4_ * fVar75 + auVar73._8_4_ * fVar109 + auVar95._8_4_;
  auVar83._12_4_ = auVar74._12_4_ * fVar75 + auVar73._12_4_ * fVar109 + auVar95._12_4_;
  local_e8 = vmovlps_avx(auVar83);
  local_e0 = vextractps_avx(auVar83,2);
  local_d8 = local_68 * query->radius;
  local_88 = context->query_ws;
  local_60 = context->userPtr;
  local_90 = 0;
  local_78._0_8_ = context->func;
  local_78._8_8_ = context->userContext;
  local_58 = 0xffffffffffffffff;
  fVar75 = local_88->radius;
  local_48._4_4_ = fVar75;
  local_48._0_4_ = fVar75;
  local_48._8_4_ = fVar75;
  local_48._12_4_ = fVar75;
  if (bVar9) {
    if (fVar75 < INFINITY) {
      lVar13 = vpextrq_avx(local_78,1);
      if (*(int *)(lVar13 + 0x88) != 0) {
        lVar12 = (ulong)(*(int *)(lVar13 + 0x88) - 1) * 0x40;
        pfVar1 = (float *)(lVar13 + lVar12);
        pfVar2 = (float *)(lVar13 + 0x10 + lVar12);
        pfVar3 = (float *)(lVar13 + 0x20 + lVar12);
        auVar95 = *(undefined1 (*) [16])(lVar13 + 0x30 + lVar12);
        auVar71 = vshufps_avx(local_48,local_48,0);
        fVar155 = (float)((uint)auVar71._0_4_ ^ auVar157._0_4_);
        fVar158 = (float)((uint)auVar71._4_4_ ^ auVar157._4_4_);
        fVar159 = (float)((uint)auVar71._8_4_ ^ auVar157._8_4_);
        fVar160 = (float)((uint)auVar71._12_4_ ^ auVar157._12_4_);
        auVar151._0_4_ = auVar71._0_4_ * *pfVar3;
        auVar151._4_4_ = auVar71._4_4_ * pfVar3[1];
        auVar151._8_4_ = auVar71._8_4_ * pfVar3[2];
        auVar151._12_4_ = auVar71._12_4_ * pfVar3[3];
        auVar73 = vsubps_avx(auVar95,auVar151);
        fVar161 = fVar155 * *pfVar2;
        fVar164 = fVar158 * pfVar2[1];
        fVar165 = fVar159 * pfVar2[2];
        fVar166 = fVar160 * pfVar2[3];
        fVar167 = fVar161 + auVar73._0_4_;
        fVar172 = fVar164 + auVar73._4_4_;
        fVar173 = fVar165 + auVar73._8_4_;
        fVar174 = fVar166 + auVar73._12_4_;
        fVar155 = fVar155 * *pfVar1;
        fVar158 = fVar158 * pfVar1[1];
        fVar159 = fVar159 * pfVar1[2];
        fVar160 = fVar160 * pfVar1[3];
        auVar175._0_4_ = fVar167 + fVar155;
        auVar175._4_4_ = fVar172 + fVar158;
        auVar175._8_4_ = fVar173 + fVar159;
        auVar175._12_4_ = fVar174 + fVar160;
        auVar179._8_4_ = 0x7f800000;
        auVar179._0_8_ = 0x7f8000007f800000;
        auVar179._12_4_ = 0x7f800000;
        auVar74 = vminps_avx(auVar179,auVar175);
        auVar183._8_4_ = 0xff800000;
        auVar183._0_8_ = 0xff800000ff800000;
        auVar183._12_4_ = 0xff800000;
        auVar71 = vmaxps_avx(auVar183,auVar175);
        fVar109 = fVar75 * *pfVar3 + auVar95._0_4_;
        fVar122 = fVar75 * pfVar3[1] + auVar95._4_4_;
        fVar123 = fVar75 * pfVar3[2] + auVar95._8_4_;
        fVar124 = fVar75 * pfVar3[3] + auVar95._12_4_;
        fVar161 = fVar161 + fVar109;
        fVar164 = fVar164 + fVar122;
        fVar165 = fVar165 + fVar123;
        fVar166 = fVar166 + fVar124;
        auVar163._0_4_ = fVar155 + fVar161;
        auVar163._4_4_ = fVar158 + fVar164;
        auVar163._8_4_ = fVar159 + fVar165;
        auVar163._12_4_ = fVar160 + fVar166;
        auVar74 = vminps_avx(auVar74,auVar163);
        auVar95 = vmaxps_avx(auVar71,auVar163);
        fVar93 = fVar75 * *pfVar2;
        fVar106 = fVar75 * pfVar2[1];
        fVar107 = fVar75 * pfVar2[2];
        fVar108 = fVar75 * pfVar2[3];
        fVar144 = fVar93 + auVar73._0_4_;
        fVar152 = fVar106 + auVar73._4_4_;
        fVar153 = fVar107 + auVar73._8_4_;
        fVar154 = fVar108 + auVar73._12_4_;
        auVar176._0_4_ = fVar155 + fVar144;
        auVar176._4_4_ = fVar158 + fVar152;
        auVar176._8_4_ = fVar159 + fVar153;
        auVar176._12_4_ = fVar160 + fVar154;
        auVar71 = vminps_avx(auVar74,auVar176);
        auVar95 = vmaxps_avx(auVar95,auVar176);
        fVar93 = fVar93 + fVar109;
        fVar106 = fVar106 + fVar122;
        fVar107 = fVar107 + fVar123;
        fVar108 = fVar108 + fVar124;
        auVar112._0_4_ = fVar155 + fVar93;
        auVar112._4_4_ = fVar158 + fVar106;
        auVar112._8_4_ = fVar159 + fVar107;
        auVar112._12_4_ = fVar160 + fVar108;
        auVar71 = vminps_avx(auVar71,auVar112);
        auVar95 = vmaxps_avx(auVar95,auVar112);
        fVar109 = fVar75 * *pfVar1;
        fVar122 = fVar75 * pfVar1[1];
        fVar123 = fVar75 * pfVar1[2];
        fVar75 = fVar75 * pfVar1[3];
        auVar84._0_4_ = fVar167 + fVar109;
        auVar84._4_4_ = fVar172 + fVar122;
        auVar84._8_4_ = fVar173 + fVar123;
        auVar84._12_4_ = fVar174 + fVar75;
        auVar71 = vminps_avx(auVar71,auVar84);
        auVar95 = vmaxps_avx(auVar95,auVar84);
        auVar113._0_4_ = fVar109 + fVar161;
        auVar113._4_4_ = fVar122 + fVar164;
        auVar113._8_4_ = fVar123 + fVar165;
        auVar113._12_4_ = fVar75 + fVar166;
        auVar71 = vminps_avx(auVar71,auVar113);
        auVar95 = vmaxps_avx(auVar95,auVar113);
        auVar114._0_4_ = fVar109 + fVar144;
        auVar114._4_4_ = fVar122 + fVar152;
        auVar114._8_4_ = fVar123 + fVar153;
        auVar114._12_4_ = fVar75 + fVar154;
        auVar71 = vminps_avx(auVar71,auVar114);
        auVar95 = vmaxps_avx(auVar95,auVar114);
        auVar39._0_4_ = fVar109 + fVar93;
        auVar39._4_4_ = fVar122 + fVar106;
        auVar39._8_4_ = fVar123 + fVar107;
        auVar39._12_4_ = fVar75 + fVar108;
        auVar71 = vminps_avx(auVar71,auVar39);
        auVar95 = vmaxps_avx(auVar95,auVar39);
        auVar95 = vsubps_avx(auVar95,auVar71);
        local_48._0_4_ = auVar95._0_4_ * 0.5;
        local_48._4_4_ = auVar95._4_4_ * 0.5;
        local_48._8_4_ = auVar95._8_4_ * 0.5;
        local_48._12_4_ = auVar95._12_4_ * 0.5;
      }
    }
  }
  else {
    local_48 = vshufps_avx(ZEXT416((uint)(local_68 * fVar75)),ZEXT416((uint)(local_68 * fVar75)),0);
  }
  local_98 = p_Var21;
  local_80 = uVar19;
  uVar10 = (**(code **)(p_Var21 + 0x88))(p_Var21 + 0x58,&local_e8);
  pRVar8 = context->userContext;
  uVar18 = pRVar8->instStackSize - 1;
  pRVar8->instStackSize = uVar18;
  pRVar8->instID[uVar18] = 0xffffffff;
  pRVar8->instPrimID[pRVar8->instStackSize] = 0xffffffff;
  return (bool)uVar10;
}

Assistant:

bool InstanceArrayIntersector1MB::pointQuery(PointQuery* query, PointQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      const AffineSpace3fa local2world = instance->getLocal2World(prim.primID_, query->time);
      const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, query->time);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, prim.primID_, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func, 
          context->userContext,
          similarityScale,
          context->userPtr); 

        bool changed = object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }